

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  RTCRayQueryFlags *pRVar2;
  Primitive *pPVar3;
  undefined1 (*pauVar4) [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  int iVar8;
  Geometry *pGVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  float *pfVar13;
  RTCFeatureFlags RVar14;
  undefined6 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined8 uVar35;
  undefined1 auVar36 [16];
  int iVar37;
  undefined4 uVar38;
  ulong uVar39;
  ulong uVar40;
  RTCFilterFunctionN p_Var41;
  RayHitK<4> *pRVar42;
  int iVar43;
  ulong uVar44;
  RTCIntersectArguments *pRVar45;
  RTCIntersectArguments *pRVar46;
  Geometry *pGVar47;
  long lVar48;
  ulong uVar49;
  LinearSpace3fa *pLVar50;
  long lVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  short sVar59;
  float fVar60;
  float fVar61;
  undefined2 uVar95;
  float fVar96;
  float fVar98;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  float fVar97;
  float fVar99;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar101;
  float fVar129;
  float fVar131;
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar134;
  float fVar135;
  float fVar145;
  float fVar147;
  vfloat4 v;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  float fVar162;
  float fVar164;
  undefined1 auVar152 [16];
  float fVar151;
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  float fVar178;
  float fVar180;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar179;
  float fVar181;
  float fVar182;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  float fVar197;
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar200;
  float fVar205;
  float fVar207;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar238;
  float fVar239;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar241 [16];
  float fVar244;
  float fVar245;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar252;
  float fVar253;
  float fVar259;
  float fVar260;
  undefined1 auVar254 [16];
  float fVar261;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar262;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  LinearSpace3fa *local_3e0;
  Precalculations *local_3d8;
  Primitive *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  RTCFilterFunctionNArguments local_348;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 (*local_2a8) [16];
  RayHitK<4> *local_2a0;
  undefined1 local_298 [16];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint local_1e8;
  int local_1e4;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  float local_188 [4];
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168 [4];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [12];
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 uVar94;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  
  PVar7 = prim[1];
  uVar39 = (ulong)(byte)PVar7;
  pPVar3 = prim + uVar39 * 0x19 + 6;
  fVar147 = *(float *)(pPVar3 + 0xc);
  fVar150 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar147;
  fVar162 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar147;
  fVar164 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar147;
  fVar134 = *(float *)(ray + k * 4 + 0x40) * fVar147;
  fVar145 = *(float *)(ray + k * 4 + 0x50) * fVar147;
  fVar147 = *(float *)(ray + k * 4 + 0x60) * fVar147;
  uVar38 = *(undefined4 *)(prim + uVar39 * 4 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar40;
  auVar71._12_2_ = uVar95;
  auVar71._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar189._12_4_ = auVar71._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar40;
  auVar189._10_2_ = uVar95;
  auVar190._10_6_ = auVar189._10_6_;
  auVar190._8_2_ = uVar95;
  auVar190._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar16._4_8_ = auVar190._8_8_;
  auVar16._2_2_ = uVar95;
  auVar16._0_2_ = uVar95;
  fVar100 = (float)((int)sVar59 >> 8);
  fVar129 = (float)(auVar16._0_4_ >> 0x18);
  fVar131 = (float)(auVar190._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + uVar39 * 5 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar40;
  auVar64._12_2_ = uVar95;
  auVar64._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar40;
  auVar63._10_2_ = uVar95;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar95;
  auVar62._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar17._4_8_ = auVar62._8_8_;
  auVar17._2_2_ = uVar95;
  auVar17._0_2_ = uVar95;
  fVar167 = (float)((int)sVar59 >> 8);
  fVar178 = (float)(auVar17._0_4_ >> 0x18);
  fVar180 = (float)(auVar62._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + uVar39 * 6 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar40;
  auVar67._12_2_ = uVar95;
  auVar67._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar40;
  auVar66._10_2_ = uVar95;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar95;
  auVar65._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar18._4_8_ = auVar65._8_8_;
  auVar18._2_2_ = uVar95;
  auVar18._0_2_ = uVar95;
  fVar199 = (float)((int)sVar59 >> 8);
  fVar205 = (float)(auVar18._0_4_ >> 0x18);
  fVar207 = (float)(auVar65._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + uVar39 * 0xb + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar40;
  auVar70._12_2_ = uVar95;
  auVar70._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar40;
  auVar69._10_2_ = uVar95;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar95;
  auVar68._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar19._4_8_ = auVar68._8_8_;
  auVar19._2_2_ = uVar95;
  auVar19._0_2_ = uVar95;
  fVar60 = (float)((int)sVar59 >> 8);
  fVar96 = (float)(auVar19._0_4_ >> 0x18);
  fVar98 = (float)(auVar68._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar40;
  auVar186._12_2_ = uVar95;
  auVar186._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar40;
  auVar185._10_2_ = uVar95;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar95;
  auVar184._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar20._4_8_ = auVar184._8_8_;
  auVar20._2_2_ = uVar95;
  auVar20._0_2_ = uVar95;
  fVar183 = (float)((int)sVar59 >> 8);
  fVar197 = (float)(auVar20._0_4_ >> 0x18);
  fVar198 = (float)(auVar184._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + (uint)(byte)PVar7 * 0xc + uVar39 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar40;
  auVar215._12_2_ = uVar95;
  auVar215._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar40;
  auVar214._10_2_ = uVar95;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar95;
  auVar213._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar21._4_8_ = auVar213._8_8_;
  auVar21._2_2_ = uVar95;
  auVar21._0_2_ = uVar95;
  fVar240 = (float)((int)sVar59 >> 8);
  fVar242 = (float)(auVar21._0_4_ >> 0x18);
  fVar243 = (float)(auVar213._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  uVar38 = *(undefined4 *)(prim + uVar49 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar40;
  auVar218._12_2_ = uVar95;
  auVar218._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar40;
  auVar217._10_2_ = uVar95;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar95;
  auVar216._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar22._4_8_ = auVar216._8_8_;
  auVar22._2_2_ = uVar95;
  auVar22._0_2_ = uVar95;
  fVar235 = (float)((int)sVar59 >> 8);
  fVar238 = (float)(auVar22._0_4_ >> 0x18);
  fVar239 = (float)(auVar216._8_4_ >> 0x18);
  uVar38 = *(undefined4 *)(prim + uVar49 + uVar39 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar40;
  auVar221._12_2_ = uVar95;
  auVar221._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar40;
  auVar220._10_2_ = uVar95;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar95;
  auVar219._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar23._4_8_ = auVar219._8_8_;
  auVar23._2_2_ = uVar95;
  auVar23._0_2_ = uVar95;
  fVar244 = (float)((int)sVar59 >> 8);
  fVar248 = (float)(auVar23._0_4_ >> 0x18);
  fVar250 = (float)(auVar219._8_4_ >> 0x18);
  uVar44 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  uVar38 = *(undefined4 *)(prim + uVar44 + 6);
  uVar94 = (undefined1)((uint)uVar38 >> 0x18);
  uVar95 = CONCAT11(uVar94,uVar94);
  uVar94 = (undefined1)((uint)uVar38 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar95,uVar94),CONCAT14(uVar94,uVar38));
  uVar94 = (undefined1)((uint)uVar38 >> 8);
  uVar15 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar94),uVar94);
  sVar59 = CONCAT11((char)uVar38,(char)uVar38);
  uVar40 = CONCAT62(uVar15,sVar59);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar40;
  auVar256._12_2_ = uVar95;
  auVar256._14_2_ = uVar95;
  uVar95 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar40;
  auVar255._10_2_ = uVar95;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar95;
  auVar254._0_8_ = uVar40;
  uVar95 = (undefined2)uVar15;
  auVar24._4_8_ = auVar254._8_8_;
  auVar24._2_2_ = uVar95;
  auVar24._0_2_ = uVar95;
  fVar61 = (float)((int)sVar59 >> 8);
  fVar97 = (float)(auVar24._0_4_ >> 0x18);
  fVar99 = (float)(auVar254._8_4_ >> 0x18);
  fVar262 = fVar134 * fVar100 + fVar145 * fVar167 + fVar147 * fVar199;
  fVar266 = fVar134 * fVar129 + fVar145 * fVar178 + fVar147 * fVar205;
  fVar267 = fVar134 * fVar131 + fVar145 * fVar180 + fVar147 * fVar207;
  fVar268 = fVar134 * (float)(auVar189._12_4_ >> 0x18) +
            fVar145 * (float)(auVar63._12_4_ >> 0x18) + fVar147 * (float)(auVar66._12_4_ >> 0x18);
  fVar253 = fVar134 * fVar60 + fVar145 * fVar183 + fVar147 * fVar240;
  fVar259 = fVar134 * fVar96 + fVar145 * fVar197 + fVar147 * fVar242;
  fVar260 = fVar134 * fVar98 + fVar145 * fVar198 + fVar147 * fVar243;
  fVar261 = fVar134 * (float)(auVar69._12_4_ >> 0x18) +
            fVar145 * (float)(auVar185._12_4_ >> 0x18) + fVar147 * (float)(auVar214._12_4_ >> 0x18);
  fVar210 = fVar134 * fVar235 + fVar145 * fVar244 + fVar147 * fVar61;
  fVar227 = fVar134 * fVar238 + fVar145 * fVar248 + fVar147 * fVar97;
  fVar230 = fVar134 * fVar239 + fVar145 * fVar250 + fVar147 * fVar99;
  fVar134 = fVar134 * (float)(auVar217._12_4_ >> 0x18) +
            fVar145 * (float)(auVar220._12_4_ >> 0x18) + fVar147 * (float)(auVar255._12_4_ >> 0x18);
  uVar38 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar167 = fVar100 * fVar150 + fVar167 * fVar162 + fVar199 * fVar164;
  fVar178 = fVar129 * fVar150 + fVar178 * fVar162 + fVar205 * fVar164;
  fVar180 = fVar131 * fVar150 + fVar180 * fVar162 + fVar207 * fVar164;
  fVar199 = (float)(auVar189._12_4_ >> 0x18) * fVar150 +
            (float)(auVar63._12_4_ >> 0x18) * fVar162 + (float)(auVar66._12_4_ >> 0x18) * fVar164;
  fVar205 = fVar60 * fVar150 + fVar183 * fVar162 + fVar240 * fVar164;
  fVar207 = fVar96 * fVar150 + fVar197 * fVar162 + fVar242 * fVar164;
  fVar240 = fVar98 * fVar150 + fVar198 * fVar162 + fVar243 * fVar164;
  fVar242 = (float)(auVar69._12_4_ >> 0x18) * fVar150 +
            (float)(auVar185._12_4_ >> 0x18) * fVar162 + (float)(auVar214._12_4_ >> 0x18) * fVar164;
  fVar183 = fVar150 * fVar235 + fVar162 * fVar244 + fVar164 * fVar61;
  fVar197 = fVar150 * fVar238 + fVar162 * fVar248 + fVar164 * fVar97;
  fVar198 = fVar150 * fVar239 + fVar162 * fVar250 + fVar164 * fVar99;
  fVar150 = fVar150 * (float)(auVar217._12_4_ >> 0x18) +
            fVar162 * (float)(auVar220._12_4_ >> 0x18) + fVar164 * (float)(auVar255._12_4_ >> 0x18);
  fVar147 = (float)DAT_01f80d30;
  fVar60 = DAT_01f80d30._4_4_;
  fVar61 = DAT_01f80d30._8_4_;
  fVar96 = DAT_01f80d30._12_4_;
  uVar52 = -(uint)(fVar147 <= ABS(fVar262));
  uVar53 = -(uint)(fVar60 <= ABS(fVar266));
  uVar55 = -(uint)(fVar61 <= ABS(fVar267));
  uVar57 = -(uint)(fVar96 <= ABS(fVar268));
  auVar263._0_4_ = (uint)fVar262 & uVar52;
  auVar263._4_4_ = (uint)fVar266 & uVar53;
  auVar263._8_4_ = (uint)fVar267 & uVar55;
  auVar263._12_4_ = (uint)fVar268 & uVar57;
  auVar168._0_4_ = ~uVar52 & (uint)fVar147;
  auVar168._4_4_ = ~uVar53 & (uint)fVar60;
  auVar168._8_4_ = ~uVar55 & (uint)fVar61;
  auVar168._12_4_ = ~uVar57 & (uint)fVar96;
  auVar168 = auVar168 | auVar263;
  uVar52 = -(uint)(fVar147 <= ABS(fVar253));
  uVar53 = -(uint)(fVar60 <= ABS(fVar259));
  uVar55 = -(uint)(fVar61 <= ABS(fVar260));
  uVar57 = -(uint)(fVar96 <= ABS(fVar261));
  auVar257._0_4_ = (uint)fVar253 & uVar52;
  auVar257._4_4_ = (uint)fVar259 & uVar53;
  auVar257._8_4_ = (uint)fVar260 & uVar55;
  auVar257._12_4_ = (uint)fVar261 & uVar57;
  auVar187._0_4_ = ~uVar52 & (uint)fVar147;
  auVar187._4_4_ = ~uVar53 & (uint)fVar60;
  auVar187._8_4_ = ~uVar55 & (uint)fVar61;
  auVar187._12_4_ = ~uVar57 & (uint)fVar96;
  auVar187 = auVar187 | auVar257;
  uVar52 = -(uint)(fVar147 <= ABS(fVar210));
  uVar53 = -(uint)(fVar60 <= ABS(fVar227));
  uVar55 = -(uint)(fVar61 <= ABS(fVar230));
  uVar57 = -(uint)(fVar96 <= ABS(fVar134));
  auVar222._0_4_ = (uint)fVar210 & uVar52;
  auVar222._4_4_ = (uint)fVar227 & uVar53;
  auVar222._8_4_ = (uint)fVar230 & uVar55;
  auVar222._12_4_ = (uint)fVar134 & uVar57;
  auVar201._0_4_ = ~uVar52 & (uint)fVar147;
  auVar201._4_4_ = ~uVar53 & (uint)fVar60;
  auVar201._8_4_ = ~uVar55 & (uint)fVar61;
  auVar201._12_4_ = ~uVar57 & (uint)fVar96;
  auVar201 = auVar201 | auVar222;
  auVar71 = rcpps(_DAT_01f80d30,auVar168);
  fVar147 = auVar71._0_4_;
  fVar96 = auVar71._4_4_;
  fVar99 = auVar71._8_4_;
  fVar131 = auVar71._12_4_;
  fVar147 = (1.0 - auVar168._0_4_ * fVar147) * fVar147 + fVar147;
  fVar96 = (1.0 - auVar168._4_4_ * fVar96) * fVar96 + fVar96;
  fVar99 = (1.0 - auVar168._8_4_ * fVar99) * fVar99 + fVar99;
  fVar131 = (1.0 - auVar168._12_4_ * fVar131) * fVar131 + fVar131;
  auVar71 = rcpps(auVar71,auVar187);
  fVar60 = auVar71._0_4_;
  fVar97 = auVar71._4_4_;
  fVar100 = auVar71._8_4_;
  fVar134 = auVar71._12_4_;
  fVar60 = (1.0 - auVar187._0_4_ * fVar60) * fVar60 + fVar60;
  fVar97 = (1.0 - auVar187._4_4_ * fVar97) * fVar97 + fVar97;
  fVar100 = (1.0 - auVar187._8_4_ * fVar100) * fVar100 + fVar100;
  fVar134 = (1.0 - auVar187._12_4_ * fVar134) * fVar134 + fVar134;
  auVar71 = rcpps(auVar71,auVar201);
  fVar61 = auVar71._0_4_;
  fVar98 = auVar71._4_4_;
  fVar129 = auVar71._8_4_;
  fVar145 = auVar71._12_4_;
  fVar61 = (1.0 - auVar201._0_4_ * fVar61) * fVar61 + fVar61;
  fVar98 = (1.0 - auVar201._4_4_ * fVar98) * fVar98 + fVar98;
  fVar129 = (1.0 - auVar201._8_4_ * fVar129) * fVar129 + fVar129;
  fVar145 = (1.0 - auVar201._12_4_ * fVar145) * fVar145 + fVar145;
  uVar40 = *(ulong *)(prim + uVar39 * 7 + 6);
  uVar95 = (undefined2)(uVar40 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar40;
  auVar74._12_2_ = uVar95;
  auVar74._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar40 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar40;
  auVar73._10_2_ = uVar95;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar95;
  auVar72._0_8_ = uVar40;
  uVar95 = (undefined2)(uVar40 >> 0x10);
  auVar25._4_8_ = auVar72._8_8_;
  auVar25._2_2_ = uVar95;
  auVar25._0_2_ = uVar95;
  auVar169._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar178) * fVar96,
                ((float)(int)(short)uVar40 - fVar167) * fVar147);
  auVar169._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar180) * fVar99;
  auVar169._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar199) * fVar131;
  uVar40 = *(ulong *)(prim + uVar39 * 9 + 6);
  uVar95 = (undefined2)(uVar40 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar40;
  auVar77._12_2_ = uVar95;
  auVar77._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar40 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar40;
  auVar76._10_2_ = uVar95;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar95;
  auVar75._0_8_ = uVar40;
  uVar95 = (undefined2)(uVar40 >> 0x10);
  auVar26._4_8_ = auVar75._8_8_;
  auVar26._2_2_ = uVar95;
  auVar26._0_2_ = uVar95;
  auVar202._0_4_ = ((float)(int)(short)uVar40 - fVar167) * fVar147;
  auVar202._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar178) * fVar96;
  auVar202._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar180) * fVar99;
  auVar202._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar199) * fVar131;
  uVar40 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  uVar49 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar39 * -2 + 6);
  uVar95 = (undefined2)(uVar49 >> 0x30);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar49;
  auVar104._12_2_ = uVar95;
  auVar104._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar49 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar49;
  auVar103._10_2_ = uVar95;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar95;
  auVar102._0_8_ = uVar49;
  uVar95 = (undefined2)(uVar49 >> 0x10);
  auVar27._4_8_ = auVar102._8_8_;
  auVar27._2_2_ = uVar95;
  auVar27._0_2_ = uVar95;
  auVar105._0_8_ =
       CONCAT44(((float)(auVar27._0_4_ >> 0x10) - fVar207) * fVar97,
                ((float)(int)(short)uVar49 - fVar205) * fVar60);
  auVar105._8_4_ = ((float)(auVar102._8_4_ >> 0x10) - fVar240) * fVar100;
  auVar105._12_4_ = ((float)(auVar103._12_4_ >> 0x10) - fVar242) * fVar134;
  uVar95 = (undefined2)(uVar40 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar40;
  auVar80._12_2_ = uVar95;
  auVar80._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar40 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar40;
  auVar79._10_2_ = uVar95;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar95;
  auVar78._0_8_ = uVar40;
  uVar95 = (undefined2)(uVar40 >> 0x10);
  auVar28._4_8_ = auVar78._8_8_;
  auVar28._2_2_ = uVar95;
  auVar28._0_2_ = uVar95;
  auVar236._0_4_ = ((float)(int)(short)uVar40 - fVar205) * fVar60;
  auVar236._4_4_ = ((float)(auVar28._0_4_ >> 0x10) - fVar207) * fVar97;
  auVar236._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar240) * fVar100;
  auVar236._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar242) * fVar134;
  uVar40 = *(ulong *)(prim + uVar44 + uVar39 + 6);
  uVar95 = (undefined2)(uVar40 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar40;
  auVar83._12_2_ = uVar95;
  auVar83._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar40 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar40;
  auVar82._10_2_ = uVar95;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar95;
  auVar81._0_8_ = uVar40;
  uVar95 = (undefined2)(uVar40 >> 0x10);
  auVar29._4_8_ = auVar81._8_8_;
  auVar29._2_2_ = uVar95;
  auVar29._0_2_ = uVar95;
  auVar84._0_8_ =
       CONCAT44(((float)(auVar29._0_4_ >> 0x10) - fVar197) * fVar98,
                ((float)(int)(short)uVar40 - fVar183) * fVar61);
  auVar84._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar198) * fVar129;
  auVar84._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar150) * fVar145;
  uVar40 = *(ulong *)(prim + uVar39 * 0x17 + 6);
  uVar95 = (undefined2)(uVar40 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar40;
  auVar225._12_2_ = uVar95;
  auVar225._14_2_ = uVar95;
  uVar95 = (undefined2)(uVar40 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar40;
  auVar224._10_2_ = uVar95;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar95;
  auVar223._0_8_ = uVar40;
  uVar95 = (undefined2)(uVar40 >> 0x10);
  auVar30._4_8_ = auVar223._8_8_;
  auVar30._2_2_ = uVar95;
  auVar30._0_2_ = uVar95;
  auVar226._0_4_ = ((float)(int)(short)uVar40 - fVar183) * fVar61;
  auVar226._4_4_ = ((float)(auVar30._0_4_ >> 0x10) - fVar197) * fVar98;
  auVar226._8_4_ = ((float)(auVar223._8_4_ >> 0x10) - fVar198) * fVar129;
  auVar226._12_4_ = ((float)(auVar224._12_4_ >> 0x10) - fVar150) * fVar145;
  auVar188._8_4_ = auVar169._8_4_;
  auVar188._0_8_ = auVar169._0_8_;
  auVar188._12_4_ = auVar169._12_4_;
  auVar189 = minps(auVar188,auVar202);
  auVar136._8_4_ = auVar105._8_4_;
  auVar136._0_8_ = auVar105._0_8_;
  auVar136._12_4_ = auVar105._12_4_;
  auVar71 = minps(auVar136,auVar236);
  auVar189 = maxps(auVar189,auVar71);
  auVar137._8_4_ = auVar84._8_4_;
  auVar137._0_8_ = auVar84._0_8_;
  auVar137._12_4_ = auVar84._12_4_;
  auVar71 = minps(auVar137,auVar226);
  auVar152._4_4_ = uVar38;
  auVar152._0_4_ = uVar38;
  auVar152._8_4_ = uVar38;
  auVar152._12_4_ = uVar38;
  auVar71 = maxps(auVar71,auVar152);
  auVar190 = maxps(auVar189,auVar71);
  auVar189 = maxps(auVar169,auVar202);
  auVar71 = maxps(auVar105,auVar236);
  auVar189 = minps(auVar189,auVar71);
  local_48 = auVar190._0_4_ * 0.99999964;
  fStack_44 = auVar190._4_4_ * 0.99999964;
  fStack_40 = auVar190._8_4_ * 0.99999964;
  fStack_3c = auVar190._12_4_ * 0.99999964;
  auVar71 = maxps(auVar84,auVar226);
  uVar38 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar38;
  auVar106._0_4_ = uVar38;
  auVar106._8_4_ = uVar38;
  auVar106._12_4_ = uVar38;
  auVar71 = minps(auVar71,auVar106);
  auVar71 = minps(auVar189,auVar71);
  auVar107._0_4_ = -(uint)(PVar7 != (Primitive)0x0 && local_48 <= auVar71._0_4_ * 1.0000004);
  auVar107._4_4_ = -(uint)(1 < (byte)PVar7 && fStack_44 <= auVar71._4_4_ * 1.0000004);
  auVar107._8_4_ = -(uint)(2 < (byte)PVar7 && fStack_40 <= auVar71._8_4_ * 1.0000004);
  auVar107._12_4_ = -(uint)(3 < (byte)PVar7 && fStack_3c <= auVar71._12_4_ * 1.0000004);
  uVar52 = movmskps((uint)(byte)PVar7,auVar107);
  if (uVar52 != 0) {
    uVar52 = uVar52 & 0xff;
    pLVar50 = pre->ray_space + k;
    local_3b8 = mm_lookupmask_ps._0_8_;
    uStack_3b0 = mm_lookupmask_ps._8_8_;
    local_2a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3e0 = pLVar50;
    local_3d8 = pre;
    local_3d0 = prim;
    local_2a0 = ray;
    do {
      lVar10 = 0;
      if (uVar52 != 0) {
        for (; (uVar52 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar53 = *(uint *)(prim + 2);
      pRVar45 = (RTCIntersectArguments *)(ulong)uVar53;
      uVar55 = *(uint *)(prim + lVar10 * 4 + 6);
      pGVar9 = (context->scene->geometries).items[(long)pRVar45].ptr;
      lVar10 = *(long *)&pGVar9[1].time_range.upper;
      uVar40 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)uVar55 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      pfVar1 = (float *)(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar40);
      fVar96 = *pfVar1;
      fVar97 = pfVar1[1];
      uVar12 = *(undefined8 *)pfVar1;
      local_1d8 = *(undefined8 *)pfVar1;
      pfVar13 = pfVar1 + 2;
      fVar98 = *pfVar13;
      local_158 = pfVar1[3];
      uVar35 = *(undefined8 *)pfVar13;
      uStack_1d0 = *(undefined8 *)pfVar13;
      pfVar1 = (float *)(lVar10 + (long)pGVar9[1].intersectionFilterN * (uVar40 + 1));
      local_388 = *pfVar1;
      fStack_384 = pfVar1[1];
      local_1a8 = *(undefined8 *)pfVar1;
      fStack_380 = pfVar1[2];
      fStack_37c = pfVar1[3];
      uStack_1a0 = *(undefined8 *)(pfVar1 + 2);
      pGVar47 = (Geometry *)((long)pGVar9[2].pointQueryFunc * (uVar40 + 1));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar147 = *(float *)(ray + k * 4);
      fVar60 = *(float *)(ray + k * 4 + 0x10);
      fVar61 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(pGVar9[2].intersectionFilterN + uVar40 * (long)pGVar9[2].pointQueryFunc);
      local_398 = *pfVar1 * 0.33333334 + fVar96;
      fStack_394 = pfVar1[1] * 0.33333334 + fVar97;
      fStack_390 = pfVar1[2] * 0.33333334 + fVar98;
      fStack_38c = pfVar1[3] * 0.33333334 + local_158;
      pfVar1 = (float *)(pGVar9[2].intersectionFilterN + (long)pGVar47);
      local_3a8 = local_388 - *pfVar1 * 0.33333334;
      fStack_3a4 = fStack_384 - pfVar1[1] * 0.33333334;
      fStack_3a0 = fStack_380 - pfVar1[2] * 0.33333334;
      fStack_39c = fStack_37c - pfVar1[3] * 0.33333334;
      fVar199 = fVar96 - fVar147;
      fVar183 = fVar97 - fVar60;
      fVar197 = fVar98 - fVar61;
      fVar99 = (pLVar50->vx).field_0.m128[0];
      fVar100 = (pLVar50->vx).field_0.m128[1];
      fVar129 = (pLVar50->vx).field_0.m128[2];
      fVar131 = (pLVar50->vy).field_0.m128[0];
      fVar134 = (pLVar50->vy).field_0.m128[1];
      fVar145 = (pLVar50->vy).field_0.m128[2];
      fVar167 = (pLVar50->vz).field_0.m128[0];
      fVar178 = (pLVar50->vz).field_0.m128[1];
      fVar180 = (pLVar50->vz).field_0.m128[2];
      local_238 = fVar199 * fVar99 + fVar183 * fVar131 + fVar197 * fVar167;
      local_288 = fVar199 * fVar100 + fVar183 * fVar134 + fVar197 * fVar178;
      fVar162 = fVar199 * fVar129 + fVar183 * fVar145 + fVar197 * fVar180;
      fVar199 = local_398 - fVar147;
      fVar183 = fStack_394 - fVar60;
      fVar197 = fStack_390 - fVar61;
      fVar198 = fVar199 * fVar99 + fVar183 * fVar131 + fVar197 * fVar167;
      fVar150 = fVar199 * fVar100 + fVar183 * fVar134 + fVar197 * fVar178;
      local_368 = fVar199 * fVar129 + fVar183 * fVar145 + fVar197 * fVar180;
      fVar199 = local_3a8 - fVar147;
      fVar183 = fStack_3a4 - fVar60;
      fVar197 = fStack_3a0 - fVar61;
      local_2b8 = fVar199 * fVar99 + fVar183 * fVar131 + fVar197 * fVar167;
      local_2c8 = fVar199 * fVar100 + fVar183 * fVar134 + fVar197 * fVar178;
      local_2d8 = fVar199 * fVar129 + fVar183 * fVar145 + fVar197 * fVar180;
      fVar147 = local_388 - fVar147;
      fVar60 = fStack_384 - fVar60;
      fVar61 = fStack_380 - fVar61;
      fVar99 = fVar147 * fVar99 + fVar60 * fVar131 + fVar61 * fVar167;
      fVar100 = fVar147 * fVar100 + fVar60 * fVar134 + fVar61 * fVar178;
      local_268 = fVar147 * fVar129 + fVar60 * fVar145 + fVar61 * fVar180;
      auVar246._0_8_ = CONCAT44(local_288,local_238) & 0x7fffffff7fffffff;
      auVar246._8_4_ = ABS(fVar162);
      auVar246._12_4_ = ABS(local_158);
      auVar170._0_8_ = CONCAT44(fVar150,fVar198) & 0x7fffffff7fffffff;
      auVar170._8_4_ = ABS(local_368);
      auVar170._12_4_ = ABS(fStack_38c);
      auVar189 = maxps(auVar246,auVar170);
      auVar191._0_8_ = CONCAT44(local_2c8,local_2b8) & 0x7fffffff7fffffff;
      auVar191._8_4_ = ABS(local_2d8);
      auVar191._12_4_ = ABS(fStack_39c);
      auVar108._0_8_ = CONCAT44(fVar100,fVar99) & 0x7fffffff7fffffff;
      auVar108._8_4_ = ABS(local_268);
      auVar108._12_4_ = ABS(fStack_37c);
      auVar71 = maxps(auVar191,auVar108);
      auVar71 = maxps(auVar189,auVar71);
      fVar147 = auVar71._4_4_;
      if (auVar71._4_4_ <= auVar71._0_4_) {
        fVar147 = auVar71._0_4_;
      }
      auVar247._8_8_ = auVar71._8_8_;
      auVar247._0_8_ = auVar71._8_8_;
      fVar60 = (float)iVar8;
      local_298 = ZEXT416((uint)fVar60);
      if (auVar71._8_4_ <= fVar147) {
        auVar247._0_4_ = fVar147;
      }
      iVar43 = iVar8 * 0x40;
      lVar10 = (long)iVar8 * 0x44;
      fVar61 = *(float *)(bezier_basis0 + lVar10 + 0x908);
      fVar129 = *(float *)(bezier_basis0 + lVar10 + 0x90c);
      fVar131 = *(float *)(bezier_basis0 + lVar10 + 0x910);
      fVar134 = *(float *)(bezier_basis0 + lVar10 + 0x914);
      fVar147 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar10 + 0xd8c);
      fVar145 = *(float *)(bezier_basis0 + lVar10 + 0xd90);
      fVar167 = *(float *)(bezier_basis0 + lVar10 + 0xd94);
      auVar16 = *(undefined1 (*) [12])(bezier_basis0 + lVar10 + 0xd8c);
      fVar178 = *(float *)(bezier_basis0 + lVar10 + 0xd98);
      fVar180 = *(float *)(bezier_basis0 + lVar10 + 0x484);
      fVar199 = *(float *)(bezier_basis0 + lVar10 + 0x488);
      fVar183 = *(float *)(bezier_basis0 + lVar10 + 0x48c);
      fVar197 = *(float *)(bezier_basis0 + lVar10 + 0x490);
      fVar164 = *(float *)(bezier_basis0 + lVar10);
      fVar205 = *(float *)(bezier_basis0 + lVar10 + 4);
      fVar207 = *(float *)(bezier_basis0 + lVar10 + 8);
      fVar210 = *(float *)(bezier_basis0 + lVar10 + 0xc);
      local_248 = local_238 * fVar164 + fVar198 * fVar180 + local_2b8 * fVar61 + fVar99 * fVar147;
      fStack_244 = local_238 * fVar205 + fVar198 * fVar199 + local_2b8 * fVar129 + fVar99 * fVar145;
      fStack_240 = local_238 * fVar207 + fVar198 * fVar183 + local_2b8 * fVar131 + fVar99 * fVar167;
      fStack_23c = local_238 * fVar210 + fVar198 * fVar197 + local_2b8 * fVar134 + fVar99 * fVar178;
      local_2f8 = local_288 * fVar164 + fVar150 * fVar180 + local_2c8 * fVar61 + fVar100 * fVar147;
      fStack_2f4 = local_288 * fVar205 + fVar150 * fVar199 + local_2c8 * fVar129 + fVar100 * fVar145
      ;
      fStack_2f0 = local_288 * fVar207 + fVar150 * fVar183 + local_2c8 * fVar131 + fVar100 * fVar167
      ;
      fStack_2ec = local_288 * fVar210 + fVar150 * fVar197 + local_2c8 * fVar134 + fVar100 * fVar178
      ;
      local_278._0_4_ =
           local_158 * fVar164 + fStack_38c * fVar180 + fStack_39c * fVar61 + fStack_37c * fVar147;
      local_278._4_4_ =
           local_158 * fVar205 + fStack_38c * fVar199 + fStack_39c * fVar129 + fStack_37c * fVar145;
      fStack_270 = local_158 * fVar207 +
                   fStack_38c * fVar183 + fStack_39c * fVar131 + fStack_37c * fVar167;
      fStack_26c = local_158 * fVar210 +
                   fStack_38c * fVar197 + fStack_39c * fVar134 + fStack_37c * fVar178;
      fVar145 = *(float *)(bezier_basis1 + lVar10 + 0xd8c);
      fVar167 = *(float *)(bezier_basis1 + lVar10 + 0xd90);
      fVar227 = *(float *)(bezier_basis1 + lVar10 + 0xd94);
      fVar230 = *(float *)(bezier_basis1 + lVar10 + 0xd98);
      fVar235 = *(float *)(bezier_basis1 + lVar10 + 0x908);
      fVar238 = *(float *)(bezier_basis1 + lVar10 + 0x90c);
      fVar239 = *(float *)(bezier_basis1 + lVar10 + 0x910);
      fVar240 = *(float *)(bezier_basis1 + lVar10 + 0x914);
      local_138 = fStack_37c;
      fStack_134 = fStack_37c;
      fStack_130 = fStack_37c;
      fStack_12c = fStack_37c;
      fVar242 = *(float *)(bezier_basis1 + lVar10 + 0x484);
      fVar243 = *(float *)(bezier_basis1 + lVar10 + 0x488);
      fVar244 = *(float *)(bezier_basis1 + lVar10 + 0x48c);
      fVar248 = *(float *)(bezier_basis1 + lVar10 + 0x490);
      local_148 = fStack_38c;
      fStack_144 = fStack_38c;
      fStack_140 = fStack_38c;
      fStack_13c = fStack_38c;
      fVar250 = *(float *)(bezier_basis1 + lVar10);
      fVar253 = *(float *)(bezier_basis1 + lVar10 + 4);
      fVar259 = *(float *)(bezier_basis1 + lVar10 + 8);
      fVar260 = *(float *)(bezier_basis1 + lVar10 + 0xc);
      fVar211 = local_238 * fVar250 + fVar198 * fVar242 + local_2b8 * fVar235 + fVar99 * fVar145;
      fVar228 = local_238 * fVar253 + fVar198 * fVar243 + local_2b8 * fVar238 + fVar99 * fVar167;
      fVar231 = local_238 * fVar259 + fVar198 * fVar244 + local_2b8 * fVar239 + fVar99 * fVar227;
      fVar233 = local_238 * fVar260 + fVar198 * fVar248 + local_2b8 * fVar240 + fVar99 * fVar230;
      fVar261 = local_288 * fVar250 + fVar150 * fVar242 + local_2c8 * fVar235 + fVar100 * fVar145;
      fVar262 = local_288 * fVar253 + fVar150 * fVar243 + local_2c8 * fVar238 + fVar100 * fVar167;
      fVar266 = local_288 * fVar259 + fVar150 * fVar244 + local_2c8 * fVar239 + fVar100 * fVar227;
      fVar267 = local_288 * fVar260 + fVar150 * fVar248 + local_2c8 * fVar240 + fVar100 * fVar230;
      fStack_154 = local_158;
      fStack_150 = local_158;
      fStack_14c = local_158;
      auVar192._0_4_ =
           local_158 * fVar250 + fStack_38c * fVar242 + fStack_39c * fVar235 + fStack_37c * fVar145;
      auVar192._4_4_ =
           local_158 * fVar253 + fStack_38c * fVar243 + fStack_39c * fVar238 + fStack_37c * fVar167;
      auVar192._8_4_ =
           local_158 * fVar259 + fStack_38c * fVar244 + fStack_39c * fVar239 + fStack_37c * fVar227;
      auVar192._12_4_ =
           local_158 * fVar260 + fStack_38c * fVar248 + fStack_39c * fVar240 + fStack_37c * fVar230;
      fVar200 = fVar211 - local_248;
      fVar206 = fVar228 - fStack_244;
      fVar208 = fVar231 - fStack_240;
      fVar209 = fVar233 - fStack_23c;
      fVar268 = fVar261 - local_2f8;
      fVar179 = fVar262 - fStack_2f4;
      fVar181 = fVar266 - fStack_2f0;
      fVar182 = fVar267 - fStack_2ec;
      fVar147 = local_2f8 * fVar200 - local_248 * fVar268;
      fVar277 = fStack_2f4 * fVar206 - fStack_244 * fVar179;
      fVar279 = fStack_2f0 * fVar208 - fStack_240 * fVar181;
      fVar281 = fStack_2ec * fVar209 - fStack_23c * fVar182;
      auVar71 = maxps(_local_278,auVar192);
      bVar33 = fVar147 * fVar147 <=
               auVar71._0_4_ * auVar71._0_4_ * (fVar200 * fVar200 + fVar268 * fVar268) &&
               0.0 < fVar60;
      bVar34 = fVar277 * fVar277 <=
               auVar71._4_4_ * auVar71._4_4_ * (fVar206 * fVar206 + fVar179 * fVar179) &&
               1.0 < fVar60;
      bVar32 = fVar279 * fVar279 <=
               auVar71._8_4_ * auVar71._8_4_ * (fVar208 * fVar208 + fVar181 * fVar181) &&
               2.0 < fVar60;
      bVar31 = 3.0 < fVar60 &&
               fVar281 * fVar281 <=
               auVar71._12_4_ * auVar71._12_4_ * (fVar209 * fVar209 + fVar182 * fVar182);
      local_358 = auVar247._0_4_;
      fStack_354 = auVar247._4_4_;
      fStack_350 = auVar247._8_4_;
      fStack_34c = auVar247._12_4_;
      local_358 = local_358 * 4.7683716e-07;
      auVar11._4_4_ = -(uint)bVar34;
      auVar11._0_4_ = -(uint)bVar33;
      auVar11._8_4_ = -(uint)bVar32;
      auVar11._12_4_ = -(uint)bVar31;
      iVar37 = movmskps(iVar8,auVar11);
      fVar147 = *(float *)(ray + k * 4 + 0x30);
      _local_378 = ZEXT416((uint)fVar147);
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fStack_2b4 = local_2b8;
      fStack_2b0 = local_2b8;
      fStack_2ac = local_2b8;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_228 = fStack_39c;
      fStack_224 = fStack_39c;
      fStack_220 = fStack_39c;
      fStack_21c = fStack_39c;
      if (iVar37 != 0) {
        fVar151 = fVar145 * local_268 + fVar235 * local_2d8 + fVar242 * local_368 +
                  fVar250 * fVar162;
        fVar163 = fVar167 * local_268 + fVar238 * local_2d8 + fVar243 * local_368 +
                  fVar253 * fVar162;
        fVar165 = fVar227 * local_268 + fVar239 * local_2d8 + fVar244 * local_368 +
                  fVar259 * fVar162;
        fVar166 = fVar230 * local_268 + fVar240 * local_2d8 + fVar248 * local_368 +
                  fVar260 * fVar162;
        local_518._0_4_ = auVar16._0_4_;
        local_518._4_4_ = auVar16._4_4_;
        fStack_510 = auVar16._8_4_;
        fVar135 = (float)local_518._0_4_ * local_268 + fVar61 * local_2d8 + fVar180 * local_368 +
                  fVar164 * fVar162;
        fVar146 = (float)local_518._4_4_ * local_268 + fVar129 * local_2d8 + fVar199 * local_368 +
                  fVar205 * fVar162;
        fVar148 = fStack_510 * local_268 + fVar131 * local_2d8 + fVar183 * local_368 +
                  fVar207 * fVar162;
        fVar149 = fVar178 * local_268 + fVar134 * local_2d8 + fVar197 * local_368 +
                  fVar210 * fVar162;
        fVar61 = *(float *)(bezier_basis0 + lVar10 + 0x1210);
        fVar129 = *(float *)(bezier_basis0 + lVar10 + 0x1214);
        fVar131 = *(float *)(bezier_basis0 + lVar10 + 0x1218);
        fVar134 = *(float *)(bezier_basis0 + lVar10 + 0x121c);
        fVar145 = *(float *)(bezier_basis0 + lVar10 + 0x1694);
        fVar167 = *(float *)(bezier_basis0 + lVar10 + 0x1698);
        fVar178 = *(float *)(bezier_basis0 + lVar10 + 0x169c);
        fVar180 = *(float *)(bezier_basis0 + lVar10 + 0x16a0);
        fVar199 = *(float *)(bezier_basis0 + lVar10 + 0x1b18);
        fVar183 = *(float *)(bezier_basis0 + lVar10 + 0x1b1c);
        fVar197 = *(float *)(bezier_basis0 + lVar10 + 0x1b20);
        fVar164 = *(float *)(bezier_basis0 + lVar10 + 0x1b24);
        fVar205 = *(float *)(bezier_basis0 + lVar10 + 0x1f9c);
        fVar207 = *(float *)(bezier_basis0 + lVar10 + 0x1fa0);
        fVar210 = *(float *)(bezier_basis0 + lVar10 + 0x1fa4);
        fVar227 = *(float *)(bezier_basis0 + lVar10 + 0x1fa8);
        fVar245 = local_238 * fVar61 + fVar198 * fVar145 + local_2b8 * fVar199 + fVar99 * fVar205;
        fVar249 = local_238 * fVar129 + fVar198 * fVar167 + local_2b8 * fVar183 + fVar99 * fVar207;
        fVar251 = local_238 * fVar131 + fVar198 * fVar178 + local_2b8 * fVar197 + fVar99 * fVar210;
        fVar252 = local_238 * fVar134 + fVar198 * fVar180 + local_2b8 * fVar164 + fVar99 * fVar227;
        fVar276 = local_288 * fVar61 + fVar150 * fVar145 + local_2c8 * fVar199 + fVar100 * fVar205;
        fVar278 = local_288 * fVar129 + fVar150 * fVar167 + local_2c8 * fVar183 + fVar100 * fVar207;
        fVar280 = local_288 * fVar131 + fVar150 * fVar178 + local_2c8 * fVar197 + fVar100 * fVar210;
        fVar282 = local_288 * fVar134 + fVar150 * fVar180 + local_2c8 * fVar164 + fVar100 * fVar227;
        fVar230 = *(float *)(bezier_basis1 + lVar10 + 0x1210);
        fVar235 = *(float *)(bezier_basis1 + lVar10 + 0x1214);
        fVar238 = *(float *)(bezier_basis1 + lVar10 + 0x1218);
        fVar239 = *(float *)(bezier_basis1 + lVar10 + 0x121c);
        fVar240 = *(float *)(bezier_basis1 + lVar10 + 0x1b18);
        fVar242 = *(float *)(bezier_basis1 + lVar10 + 0x1b1c);
        fVar243 = *(float *)(bezier_basis1 + lVar10 + 0x1b20);
        fVar244 = *(float *)(bezier_basis1 + lVar10 + 0x1b24);
        fVar248 = *(float *)(bezier_basis1 + lVar10 + 0x1f9c);
        fVar250 = *(float *)(bezier_basis1 + lVar10 + 0x1fa0);
        fVar253 = *(float *)(bezier_basis1 + lVar10 + 0x1fa4);
        fVar259 = *(float *)(bezier_basis1 + lVar10 + 0x1fa8);
        fVar260 = *(float *)(bezier_basis1 + lVar10 + 0x1694);
        fVar277 = *(float *)(bezier_basis1 + lVar10 + 0x1698);
        fVar279 = *(float *)(bezier_basis1 + lVar10 + 0x169c);
        fVar281 = *(float *)(bezier_basis1 + lVar10 + 0x16a0);
        auVar171._0_4_ = fVar198 * fVar260 + local_2b8 * fVar240 + fVar99 * fVar248;
        auVar171._4_4_ = fVar198 * fVar277 + local_2b8 * fVar242 + fVar99 * fVar250;
        auVar171._8_4_ = fVar198 * fVar279 + local_2b8 * fVar243 + fVar99 * fVar253;
        auVar171._12_4_ = fVar198 * fVar281 + local_2b8 * fVar244 + fVar99 * fVar259;
        fVar212 = local_238 * fVar230 + auVar171._0_4_;
        fVar229 = local_238 * fVar235 + auVar171._4_4_;
        fVar232 = local_238 * fVar238 + auVar171._8_4_;
        fVar234 = local_238 * fVar239 + auVar171._12_4_;
        fVar101 = local_288 * fVar230 + fVar150 * fVar260 + local_2c8 * fVar240 + fVar100 * fVar248;
        fVar130 = local_288 * fVar235 + fVar150 * fVar277 + local_2c8 * fVar242 + fVar100 * fVar250;
        fVar132 = local_288 * fVar238 + fVar150 * fVar279 + local_2c8 * fVar243 + fVar100 * fVar253;
        fVar133 = local_288 * fVar239 + fVar150 * fVar281 + local_2c8 * fVar244 + fVar100 * fVar259;
        auVar264._0_8_ = CONCAT44(fVar249,fVar245) & 0x7fffffff7fffffff;
        auVar264._8_4_ = ABS(fVar251);
        auVar264._12_4_ = ABS(fVar252);
        auVar237._0_8_ = CONCAT44(fVar278,fVar276) & 0x7fffffff7fffffff;
        auVar237._8_4_ = ABS(fVar280);
        auVar237._12_4_ = ABS(fVar282);
        auVar71 = maxps(auVar264,auVar237);
        auVar269._0_8_ =
             CONCAT44(fVar129 * fVar162 +
                      fVar167 * local_368 + fVar183 * local_2d8 + fVar207 * local_268,
                      fVar61 * fVar162 +
                      fVar145 * local_368 + fVar199 * local_2d8 + fVar205 * local_268) &
             0x7fffffff7fffffff;
        auVar269._8_4_ =
             ABS(fVar131 * fVar162 + fVar178 * local_368 + fVar197 * local_2d8 + fVar210 * local_268
                );
        auVar269._12_4_ =
             ABS(fVar134 * fVar162 + fVar180 * local_368 + fVar164 * local_2d8 + fVar227 * local_268
                );
        auVar71 = maxps(auVar71,auVar269);
        uVar57 = -(uint)(local_358 <= auVar71._0_4_);
        uVar54 = -(uint)(local_358 <= auVar71._4_4_);
        uVar56 = -(uint)(local_358 <= auVar71._8_4_);
        uVar58 = -(uint)(local_358 <= auVar71._12_4_);
        fVar199 = (float)((uint)fVar245 & uVar57 | ~uVar57 & (uint)fVar200);
        fVar183 = (float)((uint)fVar249 & uVar54 | ~uVar54 & (uint)fVar206);
        fVar197 = (float)((uint)fVar251 & uVar56 | ~uVar56 & (uint)fVar208);
        fVar164 = (float)((uint)fVar252 & uVar58 | ~uVar58 & (uint)fVar209);
        fVar245 = (float)(~uVar57 & (uint)fVar268 | (uint)fVar276 & uVar57);
        fVar249 = (float)(~uVar54 & (uint)fVar179 | (uint)fVar278 & uVar54);
        fVar251 = (float)(~uVar56 & (uint)fVar181 | (uint)fVar280 & uVar56);
        fVar252 = (float)(~uVar58 & (uint)fVar182 | (uint)fVar282 & uVar58);
        auVar270._0_8_ = CONCAT44(fVar229,fVar212) & 0x7fffffff7fffffff;
        auVar270._8_4_ = ABS(fVar232);
        auVar270._12_4_ = ABS(fVar234);
        auVar241._0_8_ = CONCAT44(fVar130,fVar101) & 0x7fffffff7fffffff;
        auVar241._8_4_ = ABS(fVar132);
        auVar241._12_4_ = ABS(fVar133);
        auVar71 = maxps(auVar270,auVar241);
        auVar203._0_8_ =
             CONCAT44(fVar235 * fVar162 +
                      fVar277 * local_368 + fVar242 * local_2d8 + fVar250 * local_268,
                      fVar230 * fVar162 +
                      fVar260 * local_368 + fVar240 * local_2d8 + fVar248 * local_268) &
             0x7fffffff7fffffff;
        auVar203._8_4_ =
             ABS(fVar238 * fVar162 + fVar279 * local_368 + fVar243 * local_2d8 + fVar253 * local_268
                );
        auVar203._12_4_ =
             ABS(fVar239 * fVar162 + fVar281 * local_368 + fVar244 * local_2d8 + fVar259 * local_268
                );
        auVar71 = maxps(auVar71,auVar203);
        uVar57 = -(uint)(local_358 <= auVar71._0_4_);
        uVar54 = -(uint)(local_358 <= auVar71._4_4_);
        uVar56 = -(uint)(local_358 <= auVar71._8_4_);
        uVar58 = -(uint)(local_358 <= auVar71._12_4_);
        fVar145 = (float)((uint)fVar212 & uVar57 | ~uVar57 & (uint)fVar200);
        fVar167 = (float)((uint)fVar229 & uVar54 | ~uVar54 & (uint)fVar206);
        fVar178 = (float)((uint)fVar232 & uVar56 | ~uVar56 & (uint)fVar208);
        fVar180 = (float)((uint)fVar234 & uVar58 | ~uVar58 & (uint)fVar209);
        fVar230 = (float)(~uVar57 & (uint)fVar268 | (uint)fVar101 & uVar57);
        fVar235 = (float)(~uVar54 & (uint)fVar179 | (uint)fVar130 & uVar54);
        fVar238 = (float)(~uVar56 & (uint)fVar181 | (uint)fVar132 & uVar56);
        fVar239 = (float)(~uVar58 & (uint)fVar182 | (uint)fVar133 & uVar58);
        auVar109._0_4_ = fVar245 * fVar245 + fVar199 * fVar199;
        auVar109._4_4_ = fVar249 * fVar249 + fVar183 * fVar183;
        auVar109._8_4_ = fVar251 * fVar251 + fVar197 * fVar197;
        auVar109._12_4_ = fVar252 * fVar252 + fVar164 * fVar164;
        auVar71 = rsqrtps(auVar171,auVar109);
        fVar61 = auVar71._0_4_;
        fVar129 = auVar71._4_4_;
        fVar131 = auVar71._8_4_;
        fVar134 = auVar71._12_4_;
        auVar172._0_4_ = fVar61 * fVar61 * auVar109._0_4_ * 0.5 * fVar61;
        auVar172._4_4_ = fVar129 * fVar129 * auVar109._4_4_ * 0.5 * fVar129;
        auVar172._8_4_ = fVar131 * fVar131 * auVar109._8_4_ * 0.5 * fVar131;
        auVar172._12_4_ = fVar134 * fVar134 * auVar109._12_4_ * 0.5 * fVar134;
        fVar240 = fVar61 * 1.5 - auVar172._0_4_;
        fVar242 = fVar129 * 1.5 - auVar172._4_4_;
        fVar243 = fVar131 * 1.5 - auVar172._8_4_;
        fVar244 = fVar134 * 1.5 - auVar172._12_4_;
        auVar110._0_4_ = fVar230 * fVar230 + fVar145 * fVar145;
        auVar110._4_4_ = fVar235 * fVar235 + fVar167 * fVar167;
        auVar110._8_4_ = fVar238 * fVar238 + fVar178 * fVar178;
        auVar110._12_4_ = fVar239 * fVar239 + fVar180 * fVar180;
        auVar71 = rsqrtps(auVar172,auVar110);
        fVar61 = auVar71._0_4_;
        fVar129 = auVar71._4_4_;
        fVar131 = auVar71._8_4_;
        fVar134 = auVar71._12_4_;
        fVar205 = fVar61 * 1.5 - fVar61 * fVar61 * auVar110._0_4_ * 0.5 * fVar61;
        fVar207 = fVar129 * 1.5 - fVar129 * fVar129 * auVar110._4_4_ * 0.5 * fVar129;
        fVar210 = fVar131 * 1.5 - fVar131 * fVar131 * auVar110._8_4_ * 0.5 * fVar131;
        fVar227 = fVar134 * 1.5 - fVar134 * fVar134 * auVar110._12_4_ * 0.5 * fVar134;
        fVar209 = fVar245 * fVar240 * (float)local_278._0_4_;
        fVar277 = fVar249 * fVar242 * (float)local_278._4_4_;
        fVar279 = fVar251 * fVar243 * fStack_270;
        fVar281 = fVar252 * fVar244 * fStack_26c;
        fVar199 = -fVar199 * fVar240 * (float)local_278._0_4_;
        fVar183 = -fVar183 * fVar242 * (float)local_278._4_4_;
        fVar197 = -fVar197 * fVar243 * fStack_270;
        fVar164 = -fVar164 * fVar244 * fStack_26c;
        fVar212 = fVar240 * 0.0 * (float)local_278._0_4_;
        fVar229 = fVar242 * 0.0 * (float)local_278._4_4_;
        fVar232 = fVar243 * 0.0 * fStack_270;
        fVar234 = fVar244 * 0.0 * fStack_26c;
        fVar101 = fVar230 * fVar205 * auVar192._0_4_;
        fVar130 = fVar235 * fVar207 * auVar192._4_4_;
        fVar132 = fVar238 * fVar210 * auVar192._8_4_;
        fVar133 = fVar239 * fVar227 * auVar192._12_4_;
        fVar61 = fVar211 + fVar101;
        fVar129 = fVar228 + fVar130;
        fVar131 = fVar231 + fVar132;
        fVar134 = fVar233 + fVar133;
        fVar250 = -fVar145 * fVar205 * auVar192._0_4_;
        fVar259 = -fVar167 * fVar207 * auVar192._4_4_;
        fVar179 = -fVar178 * fVar210 * auVar192._8_4_;
        fVar181 = -fVar180 * fVar227 * auVar192._12_4_;
        fVar145 = fVar261 + fVar250;
        fVar167 = fVar262 + fVar259;
        fVar178 = fVar266 + fVar179;
        fVar180 = fVar267 + fVar181;
        fVar240 = fVar205 * 0.0 * auVar192._0_4_;
        fVar242 = fVar207 * 0.0 * auVar192._4_4_;
        fVar243 = fVar210 * 0.0 * auVar192._8_4_;
        fVar244 = fVar227 * 0.0 * auVar192._12_4_;
        fVar205 = local_248 - fVar209;
        fVar207 = fStack_244 - fVar277;
        fVar210 = fStack_240 - fVar279;
        fVar227 = fStack_23c - fVar281;
        fVar182 = fVar151 + fVar240;
        fVar200 = fVar163 + fVar242;
        fVar206 = fVar165 + fVar243;
        fVar208 = fVar166 + fVar244;
        fVar248 = local_2f8 - fVar199;
        fVar253 = fStack_2f4 - fVar183;
        fVar260 = fStack_2f0 - fVar197;
        fVar268 = fStack_2ec - fVar164;
        fVar230 = fVar135 - fVar212;
        fVar235 = fVar146 - fVar229;
        fVar238 = fVar148 - fVar232;
        fVar239 = fVar149 - fVar234;
        uVar57 = -(uint)(0.0 < (fVar248 * (fVar182 - fVar230) - fVar230 * (fVar145 - fVar248)) * 0.0
                               + (fVar230 * (fVar61 - fVar205) - (fVar182 - fVar230) * fVar205) *
                                 0.0 + ((fVar145 - fVar248) * fVar205 - (fVar61 - fVar205) * fVar248
                                       ));
        uVar54 = -(uint)(0.0 < (fVar253 * (fVar200 - fVar235) - fVar235 * (fVar167 - fVar253)) * 0.0
                               + (fVar235 * (fVar129 - fVar207) - (fVar200 - fVar235) * fVar207) *
                                 0.0 + ((fVar167 - fVar253) * fVar207 -
                                       (fVar129 - fVar207) * fVar253));
        uVar56 = -(uint)(0.0 < (fVar260 * (fVar206 - fVar238) - fVar238 * (fVar178 - fVar260)) * 0.0
                               + (fVar238 * (fVar131 - fVar210) - (fVar206 - fVar238) * fVar210) *
                                 0.0 + ((fVar178 - fVar260) * fVar210 -
                                       (fVar131 - fVar210) * fVar260));
        uVar58 = -(uint)(0.0 < (fVar268 * (fVar208 - fVar239) - fVar239 * (fVar180 - fVar268)) * 0.0
                               + (fVar239 * (fVar134 - fVar227) - (fVar208 - fVar239) * fVar227) *
                                 0.0 + ((fVar180 - fVar268) * fVar227 -
                                       (fVar134 - fVar227) * fVar268));
        fVar211 = (float)((uint)(fVar211 - fVar101) & uVar57 | ~uVar57 & (uint)(local_248 + fVar209)
                         );
        fVar228 = (float)((uint)(fVar228 - fVar130) & uVar54 |
                         ~uVar54 & (uint)(fStack_244 + fVar277));
        fVar231 = (float)((uint)(fVar231 - fVar132) & uVar56 |
                         ~uVar56 & (uint)(fStack_240 + fVar279));
        fVar233 = (float)((uint)(fVar233 - fVar133) & uVar58 |
                         ~uVar58 & (uint)(fStack_23c + fVar281));
        local_2e8 = (float)((uint)(fVar261 - fVar250) & uVar57 |
                           ~uVar57 & (uint)(local_2f8 + fVar199));
        fStack_2e4 = (float)((uint)(fVar262 - fVar259) & uVar54 |
                            ~uVar54 & (uint)(fStack_2f4 + fVar183));
        fStack_2e0 = (float)((uint)(fVar266 - fVar179) & uVar56 |
                            ~uVar56 & (uint)(fStack_2f0 + fVar197));
        fStack_2dc = (float)((uint)(fVar267 - fVar181) & uVar58 |
                            ~uVar58 & (uint)(fStack_2ec + fVar164));
        fVar199 = (float)((uint)(fVar151 - fVar240) & uVar57 | ~uVar57 & (uint)(fVar135 + fVar212));
        fVar183 = (float)((uint)(fVar163 - fVar242) & uVar54 | ~uVar54 & (uint)(fVar146 + fVar229));
        fVar197 = (float)((uint)(fVar165 - fVar243) & uVar56 | ~uVar56 & (uint)(fVar148 + fVar232));
        fVar164 = (float)((uint)(fVar166 - fVar244) & uVar58 | ~uVar58 & (uint)(fVar149 + fVar234));
        fVar240 = (float)((uint)fVar205 & uVar57 | ~uVar57 & (uint)fVar61);
        fVar242 = (float)((uint)fVar207 & uVar54 | ~uVar54 & (uint)fVar129);
        fVar243 = (float)((uint)fVar210 & uVar56 | ~uVar56 & (uint)fVar131);
        fVar244 = (float)((uint)fVar227 & uVar58 | ~uVar58 & (uint)fVar134);
        fVar250 = (float)((uint)fVar248 & uVar57 | ~uVar57 & (uint)fVar145);
        fVar259 = (float)((uint)fVar253 & uVar54 | ~uVar54 & (uint)fVar167);
        fVar261 = (float)((uint)fVar260 & uVar56 | ~uVar56 & (uint)fVar178);
        fVar262 = (float)((uint)fVar268 & uVar58 | ~uVar58 & (uint)fVar180);
        fVar267 = (float)((uint)fVar230 & uVar57 | ~uVar57 & (uint)fVar182);
        fVar179 = (float)((uint)fVar235 & uVar54 | ~uVar54 & (uint)fVar200);
        fVar181 = (float)((uint)fVar238 & uVar56 | ~uVar56 & (uint)fVar206);
        fVar209 = (float)((uint)fVar239 & uVar58 | ~uVar58 & (uint)fVar208);
        fVar61 = (float)((uint)fVar61 & uVar57 | ~uVar57 & (uint)fVar205) - fVar211;
        fVar129 = (float)((uint)fVar129 & uVar54 | ~uVar54 & (uint)fVar207) - fVar228;
        fVar131 = (float)((uint)fVar131 & uVar56 | ~uVar56 & (uint)fVar210) - fVar231;
        fVar134 = (float)((uint)fVar134 & uVar58 | ~uVar58 & (uint)fVar227) - fVar233;
        fVar205 = (float)((uint)fVar145 & uVar57 | ~uVar57 & (uint)fVar248) - local_2e8;
        fVar207 = (float)((uint)fVar167 & uVar54 | ~uVar54 & (uint)fVar253) - fStack_2e4;
        fVar210 = (float)((uint)fVar178 & uVar56 | ~uVar56 & (uint)fVar260) - fStack_2e0;
        fVar227 = (float)((uint)fVar180 & uVar58 | ~uVar58 & (uint)fVar268) - fStack_2dc;
        fVar248 = (float)((uint)fVar182 & uVar57 | ~uVar57 & (uint)fVar230) - fVar199;
        fVar253 = (float)((uint)fVar200 & uVar54 | ~uVar54 & (uint)fVar235) - fVar183;
        fVar260 = (float)((uint)fVar206 & uVar56 | ~uVar56 & (uint)fVar238) - fVar197;
        fVar266 = (float)((uint)fVar208 & uVar58 | ~uVar58 & (uint)fVar239) - fVar164;
        fVar208 = fVar211 - fVar240;
        fVar277 = fVar228 - fVar242;
        fVar279 = fVar231 - fVar243;
        fVar281 = fVar233 - fVar244;
        fVar230 = local_2e8 - fVar250;
        fVar235 = fStack_2e4 - fVar259;
        fVar238 = fStack_2e0 - fVar261;
        fVar239 = fStack_2dc - fVar262;
        fVar145 = fVar199 - fVar267;
        fVar167 = fVar183 - fVar179;
        fVar178 = fVar197 - fVar181;
        fVar180 = fVar164 - fVar209;
        fVar268 = (local_2e8 * fVar248 - fVar199 * fVar205) * 0.0 +
                  (fVar199 * fVar61 - fVar211 * fVar248) * 0.0 +
                  (fVar211 * fVar205 - local_2e8 * fVar61);
        fVar182 = (fStack_2e4 * fVar253 - fVar183 * fVar207) * 0.0 +
                  (fVar183 * fVar129 - fVar228 * fVar253) * 0.0 +
                  (fVar228 * fVar207 - fStack_2e4 * fVar129);
        auVar153._4_4_ = fVar182;
        auVar153._0_4_ = fVar268;
        fVar200 = (fStack_2e0 * fVar260 - fVar197 * fVar210) * 0.0 +
                  (fVar197 * fVar131 - fVar231 * fVar260) * 0.0 +
                  (fVar231 * fVar210 - fStack_2e0 * fVar131);
        fVar206 = (fStack_2dc * fVar266 - fVar164 * fVar227) * 0.0 +
                  (fVar164 * fVar134 - fVar233 * fVar266) * 0.0 +
                  (fVar233 * fVar227 - fStack_2dc * fVar134);
        auVar273._0_4_ =
             (fVar250 * fVar145 - fVar267 * fVar230) * 0.0 +
             (fVar267 * fVar208 - fVar240 * fVar145) * 0.0 + (fVar240 * fVar230 - fVar250 * fVar208)
        ;
        auVar273._4_4_ =
             (fVar259 * fVar167 - fVar179 * fVar235) * 0.0 +
             (fVar179 * fVar277 - fVar242 * fVar167) * 0.0 + (fVar242 * fVar235 - fVar259 * fVar277)
        ;
        auVar273._8_4_ =
             (fVar261 * fVar178 - fVar181 * fVar238) * 0.0 +
             (fVar181 * fVar279 - fVar243 * fVar178) * 0.0 + (fVar243 * fVar238 - fVar261 * fVar279)
        ;
        auVar273._12_4_ =
             (fVar262 * fVar180 - fVar209 * fVar239) * 0.0 +
             (fVar209 * fVar281 - fVar244 * fVar180) * 0.0 + (fVar244 * fVar239 - fVar262 * fVar281)
        ;
        auVar153._8_4_ = fVar200;
        auVar153._12_4_ = fVar206;
        auVar71 = maxps(auVar153,auVar273);
        bVar33 = auVar71._0_4_ <= 0.0 && bVar33;
        auVar154._0_4_ = -(uint)bVar33;
        bVar34 = auVar71._4_4_ <= 0.0 && bVar34;
        auVar154._4_4_ = -(uint)bVar34;
        bVar32 = auVar71._8_4_ <= 0.0 && bVar32;
        auVar154._8_4_ = -(uint)bVar32;
        bVar31 = auVar71._12_4_ <= 0.0 && bVar31;
        auVar154._12_4_ = -(uint)bVar31;
        iVar37 = movmskps(iVar37,auVar154);
        if (iVar37 == 0) {
          auVar155._8_8_ = uStack_3b0;
          auVar155._0_8_ = local_3b8;
          iVar37 = 0;
        }
        else {
          auVar173._0_4_ = fVar145 * fVar205;
          auVar173._4_4_ = fVar167 * fVar207;
          auVar173._8_4_ = fVar178 * fVar210;
          auVar173._12_4_ = fVar180 * fVar227;
          fVar240 = fVar230 * fVar248 - auVar173._0_4_;
          fVar242 = fVar235 * fVar253 - auVar173._4_4_;
          fVar243 = fVar238 * fVar260 - auVar173._8_4_;
          fVar244 = fVar239 * fVar266 - auVar173._12_4_;
          fVar145 = fVar145 * fVar61 - fVar248 * fVar208;
          fVar167 = fVar167 * fVar129 - fVar253 * fVar277;
          fVar178 = fVar178 * fVar131 - fVar260 * fVar279;
          fVar180 = fVar180 * fVar134 - fVar266 * fVar281;
          fVar61 = fVar208 * fVar205 - fVar230 * fVar61;
          fVar207 = fVar277 * fVar207 - fVar235 * fVar129;
          fVar210 = fVar279 * fVar210 - fVar238 * fVar131;
          fVar227 = fVar281 * fVar227 - fVar239 * fVar134;
          auVar193._0_4_ = fVar240 * 0.0 + fVar145 * 0.0 + fVar61;
          auVar193._4_4_ = fVar242 * 0.0 + fVar167 * 0.0 + fVar207;
          auVar193._8_4_ = fVar243 * 0.0 + fVar178 * 0.0 + fVar210;
          auVar193._12_4_ = fVar244 * 0.0 + fVar180 * 0.0 + fVar227;
          auVar71 = rcpps(auVar173,auVar193);
          fVar129 = auVar71._0_4_;
          fVar131 = auVar71._4_4_;
          fVar134 = auVar71._8_4_;
          fVar205 = auVar71._12_4_;
          fVar129 = (1.0 - auVar193._0_4_ * fVar129) * fVar129 + fVar129;
          fVar131 = (1.0 - auVar193._4_4_ * fVar131) * fVar131 + fVar131;
          fVar134 = (1.0 - auVar193._8_4_ * fVar134) * fVar134 + fVar134;
          fVar205 = (1.0 - auVar193._12_4_ * fVar205) * fVar205 + fVar205;
          fVar145 = (fVar199 * fVar61 + local_2e8 * fVar145 + fVar211 * fVar240) * fVar129;
          fVar167 = (fVar183 * fVar207 + fStack_2e4 * fVar167 + fVar228 * fVar242) * fVar131;
          fVar178 = (fVar197 * fVar210 + fStack_2e0 * fVar178 + fVar231 * fVar243) * fVar134;
          fVar180 = (fVar164 * fVar227 + fStack_2dc * fVar180 + fVar233 * fVar244) * fVar205;
          fVar61 = *(float *)(ray + k * 4 + 0x80);
          bVar33 = (fVar145 <= fVar61 && fVar147 <= fVar145) && bVar33;
          auVar85._0_4_ = -(uint)bVar33;
          bVar34 = (fVar167 <= fVar61 && fVar147 <= fVar167) && bVar34;
          auVar85._4_4_ = -(uint)bVar34;
          bVar32 = (fVar178 <= fVar61 && fVar147 <= fVar178) && bVar32;
          auVar85._8_4_ = -(uint)bVar32;
          bVar31 = (fVar180 <= fVar61 && fVar147 <= fVar180) && bVar31;
          auVar85._12_4_ = -(uint)bVar31;
          iVar37 = movmskps(iVar37,auVar85);
          if (iVar37 == 0) {
            auVar155._8_8_ = uStack_3b0;
            auVar155._0_8_ = local_3b8;
            iVar37 = 0;
          }
          else {
            auVar86._0_8_ =
                 CONCAT44(-(uint)(auVar193._4_4_ != 0.0 && bVar34),
                          -(uint)(auVar193._0_4_ != 0.0 && bVar33));
            auVar86._8_4_ = -(uint)(auVar193._8_4_ != 0.0 && bVar32);
            auVar86._12_4_ = -(uint)(auVar193._12_4_ != 0.0 && bVar31);
            iVar37 = movmskps(iVar37,auVar86);
            auVar155._8_8_ = uStack_3b0;
            auVar155._0_8_ = local_3b8;
            if (iVar37 != 0) {
              fVar268 = fVar268 * fVar129;
              fVar182 = fVar182 * fVar131;
              fVar200 = fVar200 * fVar134;
              fVar206 = fVar206 * fVar205;
              local_428 = (float)((uint)(1.0 - fVar268) & uVar57 | ~uVar57 & (uint)fVar268);
              fStack_424 = (float)((uint)(1.0 - fVar182) & uVar54 | ~uVar54 & (uint)fVar182);
              fStack_420 = (float)((uint)(1.0 - fVar200) & uVar56 | ~uVar56 & (uint)fVar200);
              fStack_41c = (float)((uint)(1.0 - fVar206) & uVar58 | ~uVar58 & (uint)fVar206);
              local_258 = (float)(~uVar57 & (uint)(auVar273._0_4_ * fVar129) |
                                 (uint)(1.0 - auVar273._0_4_ * fVar129) & uVar57);
              fStack_254 = (float)(~uVar54 & (uint)(auVar273._4_4_ * fVar131) |
                                  (uint)(1.0 - auVar273._4_4_ * fVar131) & uVar54);
              fStack_250 = (float)(~uVar56 & (uint)(auVar273._8_4_ * fVar134) |
                                  (uint)(1.0 - auVar273._8_4_ * fVar134) & uVar56);
              fStack_24c = (float)(~uVar58 & (uint)(auVar273._12_4_ * fVar205) |
                                  (uint)(1.0 - auVar273._12_4_ * fVar205) & uVar58);
              auVar155._8_4_ = auVar86._8_4_;
              auVar155._0_8_ = auVar86._0_8_;
              auVar155._12_4_ = auVar86._12_4_;
              local_438 = fVar145;
              fStack_434 = fVar167;
              fStack_430 = fVar178;
              fStack_42c = fVar180;
            }
          }
        }
        iVar37 = movmskps(iVar37,auVar155);
        if (iVar37 != 0) {
          fVar129 = (auVar192._0_4_ - (float)local_278._0_4_) * local_428 + (float)local_278._0_4_;
          fVar131 = (auVar192._4_4_ - (float)local_278._4_4_) * fStack_424 + (float)local_278._4_4_;
          fVar134 = (auVar192._8_4_ - fStack_270) * fStack_420 + fStack_270;
          fVar145 = (auVar192._12_4_ - fStack_26c) * fStack_41c + fStack_26c;
          fVar61 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          local_408._0_4_ = -(uint)(fVar61 * (fVar129 + fVar129) < local_438) & auVar155._0_4_;
          local_408._4_4_ = -(uint)(fVar61 * (fVar131 + fVar131) < fStack_434) & auVar155._4_4_;
          local_408._8_4_ = -(uint)(fVar61 * (fVar134 + fVar134) < fStack_430) & auVar155._8_4_;
          local_408._12_4_ = -(uint)(fVar61 * (fVar145 + fVar145) < fStack_42c) & auVar155._12_4_;
          iVar37 = movmskps(iVar37,local_408);
          if (iVar37 != 0) {
            local_258 = local_258 + local_258 + -1.0;
            fStack_254 = fStack_254 + fStack_254 + -1.0;
            fStack_250 = fStack_250 + fStack_250 + -1.0;
            fStack_24c = fStack_24c + fStack_24c + -1.0;
            local_1e8 = 0;
            local_1c8 = CONCAT44(fStack_394,local_398);
            uStack_1c0 = CONCAT44(fStack_38c,fStack_390);
            local_1b8 = CONCAT44(fStack_3a4,local_3a8);
            uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar60 = 1.0 / fVar60;
              local_188[0] = fVar60 * (local_428 + 0.0);
              local_188[1] = fVar60 * (fStack_424 + 1.0);
              local_188[2] = fVar60 * (fStack_420 + 2.0);
              local_188[3] = fVar60 * (fStack_41c + 3.0);
              local_178 = CONCAT44(fStack_254,local_258);
              uStack_170 = CONCAT44(fStack_24c,fStack_250);
              local_168[0] = local_438;
              local_168[1] = fStack_434;
              local_168[2] = fStack_430;
              local_168[3] = fStack_42c;
              auVar111._0_4_ = local_408._0_4_ & (uint)local_438;
              auVar111._4_4_ = local_408._4_4_ & (uint)fStack_434;
              auVar111._8_4_ = local_408._8_4_ & (uint)fStack_430;
              auVar111._12_4_ = local_408._12_4_ & (uint)fStack_42c;
              auVar138._0_8_ = CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
              auVar138._8_4_ = ~local_408._8_4_ & 0x7f800000;
              auVar138._12_4_ = ~local_408._12_4_ & 0x7f800000;
              auVar138 = auVar138 | auVar111;
              auVar156._4_4_ = auVar138._0_4_;
              auVar156._0_4_ = auVar138._4_4_;
              auVar156._8_4_ = auVar138._12_4_;
              auVar156._12_4_ = auVar138._8_4_;
              auVar71 = minps(auVar156,auVar138);
              auVar112._0_8_ = auVar71._8_8_;
              auVar112._8_4_ = auVar71._0_4_;
              auVar112._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar112,auVar71);
              auVar113._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar138._4_4_) & local_408._4_4_,
                            -(uint)(auVar71._0_4_ == auVar138._0_4_) & local_408._0_4_);
              auVar113._8_4_ = -(uint)(auVar71._8_4_ == auVar138._8_4_) & local_408._8_4_;
              auVar113._12_4_ = -(uint)(auVar71._12_4_ == auVar138._12_4_) & local_408._12_4_;
              iVar37 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar113);
              auVar87 = local_408;
              if (iVar37 != 0) {
                auVar87._8_4_ = auVar113._8_4_;
                auVar87._0_8_ = auVar113._0_8_;
                auVar87._12_4_ = auVar113._12_4_;
              }
              uVar57 = movmskps(iVar37,auVar87);
              lVar48 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar147 = local_188[lVar48];
                uVar38 = *(undefined4 *)((long)&local_178 + lVar48 * 4);
                fVar60 = 1.0 - fVar147;
                fVar129 = fVar147 * fVar60 + fVar147 * fVar60;
                fVar61 = fVar60 * fVar60 * -3.0;
                fVar131 = (fVar60 * fVar60 - fVar129) * 3.0;
                fVar60 = (fVar129 - fVar147 * fVar147) * 3.0;
                fVar129 = fVar147 * fVar147 * 3.0;
                *(float *)(ray + k * 4 + 0x80) = local_168[lVar48];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar61 * fVar96 +
                     fVar131 * local_398 + fVar60 * local_3a8 + fVar129 * local_388;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar61 * fVar97 +
                     fVar131 * fStack_394 + fVar60 * fStack_3a4 + fVar129 * fStack_384;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar61 * fVar98 +
                     fVar131 * fStack_390 + fVar60 * fStack_3a0 + fVar129 * fStack_380;
                *(float *)(ray + k * 4 + 0xf0) = fVar147;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                *(uint *)(ray + k * 4 + 0x110) = uVar55;
                *(uint *)(ray + k * 4 + 0x120) = uVar53;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4f8 = CONCAT44(uVar55,uVar55);
                uStack_4f0._0_4_ = uVar55;
                uStack_4f0._4_4_ = uVar55;
                auVar71 = *local_2a8;
                _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_218 = local_428;
                fStack_214 = fStack_424;
                fStack_210 = fStack_420;
                fStack_20c = fStack_41c;
                local_208 = local_258;
                fStack_204 = fStack_254;
                fStack_200 = fStack_250;
                fStack_1fc = fStack_24c;
                local_1f8 = local_438;
                fStack_1f4 = fStack_434;
                fStack_1f0 = fStack_430;
                fStack_1ec = fStack_42c;
                local_1e4 = iVar8;
                local_198 = local_408;
                while( true ) {
                  local_f8 = local_188[lVar48];
                  local_e8 = *(undefined4 *)((long)&local_178 + lVar48 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_168[lVar48];
                  fVar147 = 1.0 - local_f8;
                  fVar61 = local_f8 * fVar147 + local_f8 * fVar147;
                  fVar129 = (fVar61 - local_f8 * local_f8) * 3.0;
                  fVar60 = local_f8 * local_f8 * 3.0;
                  fVar61 = (fVar147 * fVar147 - fVar61) * 3.0;
                  local_348.context = context->user;
                  fVar147 = fVar147 * fVar147 * -3.0;
                  local_128._0_4_ =
                       fVar147 * fVar96 +
                       fVar61 * local_398 + fVar129 * local_3a8 + fVar60 * local_388;
                  local_118 = fVar147 * fVar97 +
                              fVar61 * fStack_394 + fVar129 * fStack_3a4 + fVar60 * fStack_384;
                  local_108 = fVar147 * fVar98 +
                              fVar61 * fStack_390 + fVar129 * fStack_3a0 + fVar60 * fStack_380;
                  local_128._4_4_ = local_128._0_4_;
                  local_128._8_4_ = local_128._0_4_;
                  fStack_11c = (float)local_128._0_4_;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  local_d8 = local_4f8;
                  uStack_d0 = uStack_4f0;
                  local_c8 = CONCAT44(uVar53,uVar53);
                  uStack_c0 = CONCAT44(uVar53,uVar53);
                  local_b8 = (local_348.context)->instID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_a8 = (local_348.context)->instPrimID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_348.valid = (int *)local_3f8;
                  pRVar46 = (RTCIntersectArguments *)pGVar9->userPtr;
                  local_348.hit = (RTCHitN *)local_128;
                  local_348.N = 4;
                  p_Var41 = pGVar9->intersectionFilterN;
                  auVar283._8_8_ = pGVar47;
                  auVar283._0_8_ = p_Var41;
                  local_3f8 = auVar71;
                  local_348.geometryUserPtr = pRVar46;
                  local_348.ray = (RTCRayN *)ray;
                  if (p_Var41 != (RTCFilterFunctionN)0x0) {
                    auVar283 = (*p_Var41)(&local_348);
                    ray = local_2a0;
                  }
                  pGVar47 = auVar283._8_8_;
                  auVar124._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                  auVar124._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                  auVar124._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                  auVar124._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                  uVar57 = movmskps(auVar283._0_4_,auVar124);
                  pRVar42 = (RayHitK<4> *)(ulong)(uVar57 ^ 0xf);
                  if ((uVar57 ^ 0xf) == 0) {
                    auVar124 = auVar124 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar46 = context->args;
                    p_Var41 = pRVar46->filter;
                    auVar36._8_8_ = pGVar47;
                    auVar36._0_8_ = p_Var41;
                    auVar284._8_8_ = pGVar47;
                    auVar284._0_8_ = p_Var41;
                    if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar46->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (auVar284 = auVar36, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar284 = (*p_Var41)(&local_348);
                      ray = local_2a0;
                    }
                    pGVar47 = auVar284._8_8_;
                    auVar92._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                    auVar92._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                    auVar92._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                    auVar92._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                    auVar124 = auVar92 ^ _DAT_01f7ae20;
                    uVar57 = movmskps(auVar284._0_4_,auVar92);
                    pRVar42 = (RayHitK<4> *)(ulong)(uVar57 ^ 0xf);
                    if ((uVar57 ^ 0xf) != 0) {
                      RVar14 = *(RTCFeatureFlags *)((long)local_348.hit + 4);
                      uVar57 = *(uint *)((long)local_348.hit + 8);
                      uVar54 = *(uint *)((long)((long)local_348.hit + 8) + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0xc0) =
                           ~auVar92._0_4_ & *(RTCRayQueryFlags *)&(local_348.hit)->field_0x0 |
                           *(RTCRayQueryFlags *)(local_348.ray + 0xc0) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xc4) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xc4) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 200) =
                           ~auVar92._8_4_ & uVar57 | *(uint *)(local_348.ray + 200) & auVar92._8_4_;
                      *(uint *)(local_348.ray + 0xcc) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0xcc) & auVar92._12_4_;
                      RVar14 = *(RTCFeatureFlags *)((long)((long)local_348.hit + 0x10) + 4);
                      uVar57 = *(uint *)((long)local_348.hit + 0x18);
                      uVar54 = *(uint *)((long)((long)local_348.hit + 0x18) + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0xd0) =
                           ~auVar92._0_4_ & *(RTCRayQueryFlags *)((long)local_348.hit + 0x10) |
                           *(RTCRayQueryFlags *)(local_348.ray + 0xd0) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xd4) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xd4) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 0xd8) =
                           ~auVar92._8_4_ & uVar57 | *(uint *)(local_348.ray + 0xd8) & auVar92._8_4_
                      ;
                      *(uint *)(local_348.ray + 0xdc) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0xdc) & auVar92._12_4_;
                      RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->feature_mask
                      ;
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                         context;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0xe0) =
                           ~auVar92._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->flags |
                           *(RTCRayQueryFlags *)(local_348.ray + 0xe0) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xe4) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xe4) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 0xe8) =
                           ~auVar92._8_4_ & uVar57 | *(uint *)(local_348.ray + 0xe8) & auVar92._8_4_
                      ;
                      *(uint *)(local_348.ray + 0xec) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0xec) & auVar92._12_4_;
                      RVar14 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                        filter + 4);
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                         intersect;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x20))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0xf0) =
                           ~auVar92._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_348.hit + 0x20))->filter |
                           *(RTCRayQueryFlags *)(local_348.ray + 0xf0) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0xf4) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0xf4) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 0xf8) =
                           ~auVar92._8_4_ & uVar57 | *(uint *)(local_348.ray + 0xf8) & auVar92._8_4_
                      ;
                      *(uint *)(local_348.ray + 0xfc) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0xfc) & auVar92._12_4_;
                      RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->feature_mask
                      ;
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                         context;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x100) =
                           ~auVar92._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->flags |
                           *(RTCRayQueryFlags *)(local_348.ray + 0x100) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0x104) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0x104) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 0x108) =
                           ~auVar92._8_4_ & uVar57 |
                           *(uint *)(local_348.ray + 0x108) & auVar92._8_4_;
                      *(uint *)(local_348.ray + 0x10c) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0x10c) & auVar92._12_4_;
                      RVar14 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                        filter + 4);
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                         intersect;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x40))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x110) =
                           *(RTCRayQueryFlags *)(local_348.ray + 0x110) & auVar92._0_4_ |
                           ~auVar92._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_348.hit + 0x40))->filter;
                      *(RTCFeatureFlags *)(local_348.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_348.ray + 0x114) & auVar92._4_4_ |
                           ~auVar92._4_4_ & RVar14;
                      *(uint *)(local_348.ray + 0x118) =
                           *(uint *)(local_348.ray + 0x118) & auVar92._8_4_ |
                           ~auVar92._8_4_ & uVar57;
                      *(uint *)(local_348.ray + 0x11c) =
                           *(uint *)(local_348.ray + 0x11c) & auVar92._12_4_ |
                           ~auVar92._12_4_ & uVar54;
                      RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->feature_mask
                      ;
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                         context;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x120) =
                           *(RTCRayQueryFlags *)(local_348.ray + 0x120) & auVar92._0_4_ |
                           ~auVar92._0_4_ &
                           ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_348.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_348.ray + 0x124) & auVar92._4_4_ |
                           ~auVar92._4_4_ & RVar14;
                      *(uint *)(local_348.ray + 0x128) =
                           *(uint *)(local_348.ray + 0x128) & auVar92._8_4_ |
                           ~auVar92._8_4_ & uVar57;
                      *(uint *)(local_348.ray + 300) =
                           *(uint *)(local_348.ray + 300) & auVar92._12_4_ |
                           ~auVar92._12_4_ & uVar54;
                      RVar14 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                        filter + 4);
                      uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                         intersect;
                      uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_348.hit + 0x60))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_348.ray + 0x130) =
                           ~auVar92._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_348.hit + 0x60))->filter |
                           *(RTCRayQueryFlags *)(local_348.ray + 0x130) & auVar92._0_4_;
                      *(RTCFeatureFlags *)(local_348.ray + 0x134) =
                           ~auVar92._4_4_ & RVar14 |
                           *(RTCFeatureFlags *)(local_348.ray + 0x134) & auVar92._4_4_;
                      *(uint *)(local_348.ray + 0x138) =
                           ~auVar92._8_4_ & uVar57 |
                           *(uint *)(local_348.ray + 0x138) & auVar92._8_4_;
                      *(uint *)(local_348.ray + 0x13c) =
                           ~auVar92._12_4_ & uVar54 |
                           *(uint *)(local_348.ray + 0x13c) & auVar92._12_4_;
                      auVar6._0_4_ = *(undefined4 *)(local_348.hit + 0x80);
                      auVar6._4_4_ = *(undefined4 *)(local_348.hit + 0x84);
                      auVar6._8_8_ = *(undefined8 *)(local_348.hit + 0x88);
                      *(undefined1 (*) [16])(local_348.ray + 0x140) =
                           ~auVar92 & auVar6 |
                           *(undefined1 (*) [16])(local_348.ray + 0x140) & auVar92;
                      pRVar42 = (RayHitK<4> *)local_348.ray;
                      pRVar46 = (RTCIntersectArguments *)local_348.hit;
                    }
                  }
                  iVar43 = (int)pRVar46;
                  auVar125._0_4_ = auVar124._0_4_ << 0x1f;
                  auVar125._4_4_ = auVar124._4_4_ << 0x1f;
                  auVar125._8_4_ = auVar124._8_4_ << 0x1f;
                  auVar125._12_4_ = auVar124._12_4_ << 0x1f;
                  iVar37 = movmskps((int)pRVar42,auVar125);
                  if (iVar37 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                  }
                  else {
                    local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_518._4_4_ = 0;
                    fStack_510 = 0.0;
                    uStack_50c = 0;
                  }
                  *(undefined4 *)(local_408 + lVar48 * 4) = 0;
                  local_408._0_4_ = -(uint)(local_438 <= (float)local_518._0_4_) & local_408._0_4_;
                  local_408._4_4_ = -(uint)(fStack_434 <= (float)local_518._0_4_) & local_408._4_4_;
                  local_408._8_4_ = -(uint)(fStack_430 <= (float)local_518._0_4_) & local_408._8_4_;
                  local_408._12_4_ =
                       -(uint)(fStack_42c <= (float)local_518._0_4_) & local_408._12_4_;
                  iVar37 = movmskps(iVar37,local_408);
                  if (iVar37 == 0) break;
                  auVar126._0_4_ = local_408._0_4_ & (uint)local_438;
                  auVar126._4_4_ = local_408._4_4_ & (uint)fStack_434;
                  auVar126._8_4_ = local_408._8_4_ & (uint)fStack_430;
                  auVar126._12_4_ = local_408._12_4_ & (uint)fStack_42c;
                  auVar144._0_8_ = CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
                  auVar144._8_4_ = ~local_408._8_4_ & 0x7f800000;
                  auVar144._12_4_ = ~local_408._12_4_ & 0x7f800000;
                  auVar144 = auVar144 | auVar126;
                  auVar161._4_4_ = auVar144._0_4_;
                  auVar161._0_4_ = auVar144._4_4_;
                  auVar161._8_4_ = auVar144._12_4_;
                  auVar161._12_4_ = auVar144._8_4_;
                  auVar189 = minps(auVar161,auVar144);
                  auVar127._0_8_ = auVar189._8_8_;
                  auVar127._8_4_ = auVar189._0_4_;
                  auVar127._12_4_ = auVar189._4_4_;
                  auVar189 = minps(auVar127,auVar189);
                  auVar128._0_8_ =
                       CONCAT44(-(uint)(auVar189._4_4_ == auVar144._4_4_) & local_408._4_4_,
                                -(uint)(auVar189._0_4_ == auVar144._0_4_) & local_408._0_4_);
                  auVar128._8_4_ = -(uint)(auVar189._8_4_ == auVar144._8_4_) & local_408._8_4_;
                  auVar128._12_4_ = -(uint)(auVar189._12_4_ == auVar144._12_4_) & local_408._12_4_;
                  iVar37 = movmskps(iVar37,auVar128);
                  auVar93 = local_408;
                  if (iVar37 != 0) {
                    auVar93._8_4_ = auVar128._8_4_;
                    auVar93._0_8_ = auVar128._0_8_;
                    auVar93._12_4_ = auVar128._12_4_;
                  }
                  uVar38 = movmskps(iVar37,auVar93);
                  uVar40 = CONCAT44((int)((ulong)pRVar42 >> 0x20),uVar38);
                  lVar48 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                    }
                  }
                }
              }
              pLVar50 = local_3e0;
              prim = local_3d0;
              pre = local_3d8;
              fVar60 = (float)local_298._0_4_;
              fVar147 = (float)local_378._0_4_;
            }
          }
        }
      }
      local_378._0_4_ = fVar147;
      local_298._0_4_ = fVar60;
      if (4 < iVar8) {
        local_68 = iVar8;
        iStack_64 = iVar8;
        iStack_60 = iVar8;
        iStack_5c = iVar8;
        fStack_354 = local_358;
        fStack_350 = local_358;
        fStack_34c = local_358;
        local_378._4_4_ = local_378._0_4_;
        fStack_370 = (float)local_378._0_4_;
        fStack_36c = (float)local_378._0_4_;
        local_98 = 1.0 / (float)local_298._0_4_;
        fStack_94 = local_98;
        fStack_90 = local_98;
        fStack_8c = local_98;
        local_78 = uVar53;
        uStack_74 = uVar53;
        uStack_70 = uVar53;
        uStack_6c = uVar53;
        local_88 = uVar55;
        uStack_84 = uVar55;
        uStack_80 = uVar55;
        uStack_7c = uVar55;
        lVar48 = 4;
        do {
          local_1e8 = (uint)lVar48;
          pRVar46 = (RTCIntersectArguments *)(bezier_basis0 + lVar10);
          pRVar2 = &pRVar46->flags + lVar48;
          fVar147 = (float)*pRVar2;
          fVar60 = (float)pRVar2[1];
          fVar61 = (float)pRVar2[2];
          fVar129 = (float)pRVar2[3];
          pfVar1 = (float *)(lVar10 + 0x21aa768 + lVar48 * 4);
          fVar131 = *pfVar1;
          fVar134 = pfVar1[1];
          fVar145 = pfVar1[2];
          fVar167 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21aabec + lVar48 * 4);
          fVar178 = *pfVar1;
          fVar180 = pfVar1[1];
          fVar199 = pfVar1[2];
          fVar183 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21ab070 + lVar48 * 4);
          fVar197 = *pfVar1;
          fVar164 = pfVar1[1];
          fVar205 = pfVar1[2];
          fVar207 = pfVar1[3];
          local_278._0_4_ =
               local_238 * fVar147 + fVar198 * fVar131 + local_2b8 * fVar178 + fVar99 * fVar197;
          local_278._4_4_ =
               fStack_234 * fVar60 + fVar198 * fVar134 + fStack_2b4 * fVar180 + fVar99 * fVar164;
          fStack_270 = fStack_230 * fVar61 +
                       fVar198 * fVar145 + fStack_2b0 * fVar199 + fVar99 * fVar205;
          fStack_26c = fStack_22c * fVar129 +
                       fVar198 * fVar167 + fStack_2ac * fVar183 + fVar99 * fVar207;
          local_248 = local_288 * fVar147 +
                      fVar150 * fVar131 + local_2c8 * fVar178 + fVar100 * fVar197;
          fStack_244 = fStack_284 * fVar60 +
                       fVar150 * fVar134 + fStack_2c4 * fVar180 + fVar100 * fVar164;
          fStack_240 = fStack_280 * fVar61 +
                       fVar150 * fVar145 + fStack_2c0 * fVar199 + fVar100 * fVar205;
          fStack_23c = fStack_27c * fVar129 +
                       fVar150 * fVar167 + fStack_2bc * fVar183 + fVar100 * fVar207;
          auVar115._0_4_ =
               local_158 * fVar147 + local_148 * fVar131 + local_228 * fVar178 + local_138 * fVar197
          ;
          auVar115._4_4_ =
               fStack_154 * fVar60 +
               fStack_144 * fVar134 + fStack_224 * fVar180 + fStack_134 * fVar164;
          auVar115._8_4_ =
               fStack_150 * fVar61 +
               fStack_140 * fVar145 + fStack_220 * fVar199 + fStack_130 * fVar205;
          auVar115._12_4_ =
               fStack_14c * fVar129 +
               fStack_13c * fVar167 + fStack_21c * fVar183 + fStack_12c * fVar207;
          pfVar1 = (float *)(bezier_basis1 + lVar10 + lVar48 * 4);
          fVar210 = *pfVar1;
          fVar227 = pfVar1[1];
          fVar230 = pfVar1[2];
          fVar235 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21acb88 + lVar48 * 4);
          fVar238 = *pfVar1;
          fVar239 = pfVar1[1];
          fVar240 = pfVar1[2];
          fVar242 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21ad00c + lVar48 * 4);
          fVar243 = *pfVar1;
          fVar244 = pfVar1[1];
          fVar248 = pfVar1[2];
          fVar250 = pfVar1[3];
          pauVar4 = (undefined1 (*) [12])(lVar10 + 0x21ad490 + lVar48 * 4);
          fVar253 = *(float *)*pauVar4;
          fVar259 = *(float *)(*pauVar4 + 4);
          fVar260 = *(float *)(*pauVar4 + 8);
          auVar16 = *pauVar4;
          fVar261 = *(float *)pauVar4[1];
          local_2e8 = local_238 * fVar210 +
                      fVar198 * fVar238 + local_2b8 * fVar243 + fVar99 * fVar253;
          fStack_2e4 = fStack_234 * fVar227 +
                       fVar198 * fVar239 + fStack_2b4 * fVar244 + fVar99 * fVar259;
          fStack_2e0 = fStack_230 * fVar230 +
                       fVar198 * fVar240 + fStack_2b0 * fVar248 + fVar99 * fVar260;
          fStack_2dc = fStack_22c * fVar235 +
                       fVar198 * fVar242 + fStack_2ac * fVar250 + fVar99 * fVar261;
          fVar181 = local_288 * fVar210 +
                    fVar150 * fVar238 + local_2c8 * fVar243 + fVar100 * fVar253;
          fVar182 = fStack_284 * fVar227 +
                    fVar150 * fVar239 + fStack_2c4 * fVar244 + fVar100 * fVar259;
          fVar200 = fStack_280 * fVar230 +
                    fVar150 * fVar240 + fStack_2c0 * fVar248 + fVar100 * fVar260;
          fVar206 = fStack_27c * fVar235 +
                    fVar150 * fVar242 + fStack_2bc * fVar250 + fVar100 * fVar261;
          auVar274._0_4_ =
               local_158 * fVar210 + local_148 * fVar238 + local_228 * fVar243 + local_138 * fVar253
          ;
          auVar274._4_4_ =
               fStack_154 * fVar227 +
               fStack_144 * fVar239 + fStack_224 * fVar244 + fStack_134 * fVar259;
          auVar274._8_4_ =
               fStack_150 * fVar230 +
               fStack_140 * fVar240 + fStack_220 * fVar248 + fStack_130 * fVar260;
          auVar274._12_4_ =
               fStack_14c * fVar235 +
               fStack_13c * fVar242 + fStack_21c * fVar250 + fStack_12c * fVar261;
          fVar266 = local_2e8 - (float)local_278._0_4_;
          fVar267 = fStack_2e4 - (float)local_278._4_4_;
          fVar268 = fStack_2e0 - fStack_270;
          fVar179 = fStack_2dc - fStack_26c;
          fVar253 = fVar181 - local_248;
          fVar259 = fVar182 - fStack_244;
          fVar260 = fVar200 - fStack_240;
          fVar262 = fVar206 - fStack_23c;
          fVar208 = local_248 * fVar266 - (float)local_278._0_4_ * fVar253;
          fVar209 = fStack_244 * fVar267 - (float)local_278._4_4_ * fVar259;
          fVar211 = fStack_240 * fVar268 - fStack_270 * fVar260;
          fVar228 = fStack_23c * fVar179 - fStack_26c * fVar262;
          auVar71 = maxps(auVar115,auVar274);
          bVar31 = fVar208 * fVar208 <=
                   auVar71._0_4_ * auVar71._0_4_ * (fVar266 * fVar266 + fVar253 * fVar253) &&
                   (int)local_1e8 < local_68;
          local_298._0_4_ = -(uint)bVar31;
          bVar32 = fVar209 * fVar209 <=
                   auVar71._4_4_ * auVar71._4_4_ * (fVar267 * fVar267 + fVar259 * fVar259) &&
                   (int)(local_1e8 | 1) < iStack_64;
          local_298._4_4_ = -(uint)bVar32;
          bVar33 = fVar211 * fVar211 <=
                   auVar71._8_4_ * auVar71._8_4_ * (fVar268 * fVar268 + fVar260 * fVar260) &&
                   (int)(local_1e8 | 2) < iStack_60;
          local_298._8_4_ = -(uint)bVar33;
          bVar34 = fVar228 * fVar228 <=
                   auVar71._12_4_ * auVar71._12_4_ * (fVar179 * fVar179 + fVar262 * fVar262) &&
                   (int)(local_1e8 | 3) < iStack_5c;
          local_298._12_4_ = -(uint)bVar34;
          uVar57 = movmskps((int)pGVar47,local_298);
          pGVar47 = (Geometry *)(ulong)uVar57;
          if (uVar57 != 0) {
            local_58 = fVar266;
            fStack_54 = fVar267;
            fStack_50 = fVar268;
            fStack_4c = fVar179;
            local_518._0_4_ = auVar16._0_4_;
            local_518._4_4_ = auVar16._4_4_;
            fStack_510 = auVar16._8_4_;
            fVar228 = (float)local_518._0_4_ * local_268 + fVar243 * local_2d8 + fVar238 * local_368
                      + fVar210 * fVar162;
            fVar231 = (float)local_518._4_4_ * fStack_264 + fVar244 * fStack_2d4 +
                      fVar239 * fStack_364 + fVar227 * fVar162;
            fVar233 = fStack_510 * fStack_260 + fVar248 * fStack_2d0 + fVar240 * fStack_360 +
                      fVar230 * fVar162;
            fVar277 = fVar261 * fStack_25c + fVar250 * fStack_2cc + fVar242 * fStack_35c +
                      fVar235 * fVar162;
            fVar132 = fVar197 * local_268 + fVar178 * local_2d8 + fVar131 * local_368 +
                      fVar147 * fVar162;
            fVar133 = fVar164 * fStack_264 + fVar180 * fStack_2d4 + fVar134 * fStack_364 +
                      fVar60 * fVar162;
            fVar135 = fVar205 * fStack_260 + fVar199 * fStack_2d0 + fVar145 * fStack_360 +
                      fVar61 * fVar162;
            fVar146 = fVar207 * fStack_25c + fVar183 * fStack_2cc + fVar167 * fStack_35c +
                      fVar129 * fVar162;
            pfVar1 = (float *)(lVar10 + 0x21ab4f4 + lVar48 * 4);
            fVar147 = *pfVar1;
            fVar60 = pfVar1[1];
            fVar61 = pfVar1[2];
            fVar129 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21ab978 + lVar48 * 4);
            fVar131 = *pfVar1;
            fVar134 = pfVar1[1];
            fVar145 = pfVar1[2];
            fVar167 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21abdfc + lVar48 * 4);
            fVar178 = *pfVar1;
            fVar180 = pfVar1[1];
            fVar199 = pfVar1[2];
            fVar183 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21ac280 + lVar48 * 4);
            fVar197 = *pfVar1;
            fVar164 = pfVar1[1];
            fVar205 = pfVar1[2];
            fVar207 = pfVar1[3];
            fVar148 = local_238 * fVar147 +
                      fVar198 * fVar131 + local_2b8 * fVar178 + fVar99 * fVar197;
            fVar149 = fStack_234 * fVar60 +
                      fVar198 * fVar134 + fStack_2b4 * fVar180 + fVar99 * fVar164;
            fVar151 = fStack_230 * fVar61 +
                      fVar198 * fVar145 + fStack_2b0 * fVar199 + fVar99 * fVar205;
            fVar163 = fStack_22c * fVar129 +
                      fVar198 * fVar167 + fStack_2ac * fVar183 + fVar99 * fVar207;
            fVar279 = local_288 * fVar147 +
                      fVar150 * fVar131 + local_2c8 * fVar178 + fVar100 * fVar197;
            fVar281 = fStack_284 * fVar60 +
                      fVar150 * fVar134 + fStack_2c4 * fVar180 + fVar100 * fVar164;
            fVar101 = fStack_280 * fVar61 +
                      fVar150 * fVar145 + fStack_2c0 * fVar199 + fVar100 * fVar205;
            fVar130 = fStack_27c * fVar129 +
                      fVar150 * fVar167 + fStack_2bc * fVar183 + fVar100 * fVar207;
            pfVar1 = (float *)(lVar10 + 0x21ad914 + lVar48 * 4);
            fVar210 = *pfVar1;
            fVar227 = pfVar1[1];
            fVar230 = pfVar1[2];
            fVar235 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21ae21c + lVar48 * 4);
            fVar238 = *pfVar1;
            fVar239 = pfVar1[1];
            fVar240 = pfVar1[2];
            fVar242 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21ae6a0 + lVar48 * 4);
            fVar243 = *pfVar1;
            fVar244 = pfVar1[1];
            fVar248 = pfVar1[2];
            fVar250 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21add98 + lVar48 * 4);
            fVar261 = *pfVar1;
            fVar208 = pfVar1[1];
            fVar209 = pfVar1[2];
            fVar211 = pfVar1[3];
            fVar165 = local_238 * fVar210 +
                      fVar198 * fVar261 + local_2b8 * fVar238 + fVar99 * fVar243;
            fVar166 = fStack_234 * fVar227 +
                      fVar198 * fVar208 + fStack_2b4 * fVar239 + fVar99 * fVar244;
            fVar212 = fStack_230 * fVar230 +
                      fVar198 * fVar209 + fStack_2b0 * fVar240 + fVar99 * fVar248;
            fVar229 = fStack_22c * fVar235 +
                      fVar198 * fVar211 + fStack_2ac * fVar242 + fVar99 * fVar250;
            fVar232 = local_288 * fVar210 +
                      fVar150 * fVar261 + local_2c8 * fVar238 + fVar100 * fVar243;
            fVar234 = fStack_284 * fVar227 +
                      fVar150 * fVar208 + fStack_2c4 * fVar239 + fVar100 * fVar244;
            fVar245 = fStack_280 * fVar230 +
                      fVar150 * fVar209 + fStack_2c0 * fVar240 + fVar100 * fVar248;
            fVar249 = fStack_27c * fVar235 +
                      fVar150 * fVar211 + fStack_2bc * fVar242 + fVar100 * fVar250;
            auVar265._0_8_ = CONCAT44(fVar149,fVar148) & 0x7fffffff7fffffff;
            auVar265._8_4_ = ABS(fVar151);
            auVar265._12_4_ = ABS(fVar163);
            auVar194._0_8_ = CONCAT44(fVar281,fVar279) & 0x7fffffff7fffffff;
            auVar194._8_4_ = ABS(fVar101);
            auVar194._12_4_ = ABS(fVar130);
            auVar71 = maxps(auVar265,auVar194);
            auVar271._0_8_ =
                 CONCAT44(fVar60 * fVar162 +
                          fVar134 * fStack_364 + fVar180 * fStack_2d4 + fVar164 * fStack_264,
                          fVar147 * fVar162 +
                          fVar131 * local_368 + fVar178 * local_2d8 + fVar197 * local_268) &
                 0x7fffffff7fffffff;
            auVar271._8_4_ =
                 ABS(fVar61 * fVar162 +
                     fVar145 * fStack_360 + fVar199 * fStack_2d0 + fVar205 * fStack_260);
            auVar271._12_4_ =
                 ABS(fVar129 * fVar162 +
                     fVar167 * fStack_35c + fVar183 * fStack_2cc + fVar207 * fStack_25c);
            auVar71 = maxps(auVar71,auVar271);
            uVar57 = -(uint)(local_358 <= auVar71._0_4_);
            uVar54 = -(uint)(fStack_354 <= auVar71._4_4_);
            uVar56 = -(uint)(fStack_350 <= auVar71._8_4_);
            uVar58 = -(uint)(fStack_34c <= auVar71._12_4_);
            auVar195._0_4_ = ~uVar57 & (uint)fVar266;
            auVar195._4_4_ = ~uVar54 & (uint)fVar267;
            auVar195._8_4_ = ~uVar56 & (uint)fVar268;
            auVar195._12_4_ = ~uVar58 & (uint)fVar179;
            auVar258._0_4_ = (uint)fVar148 & uVar57;
            auVar258._4_4_ = (uint)fVar149 & uVar54;
            auVar258._8_4_ = (uint)fVar151 & uVar56;
            auVar258._12_4_ = (uint)fVar163 & uVar58;
            auVar258 = auVar258 | auVar195;
            fVar279 = (float)(~uVar57 & (uint)fVar253 | (uint)fVar279 & uVar57);
            fVar281 = (float)(~uVar54 & (uint)fVar259 | (uint)fVar281 & uVar54);
            fVar101 = (float)(~uVar56 & (uint)fVar260 | (uint)fVar101 & uVar56);
            fVar130 = (float)(~uVar58 & (uint)fVar262 | (uint)fVar130 & uVar58);
            auVar272._0_8_ = CONCAT44(fVar166,fVar165) & 0x7fffffff7fffffff;
            auVar272._8_4_ = ABS(fVar212);
            auVar272._12_4_ = ABS(fVar229);
            auVar139._0_8_ = CONCAT44(fVar234,fVar232) & 0x7fffffff7fffffff;
            auVar139._8_4_ = ABS(fVar245);
            auVar139._12_4_ = ABS(fVar249);
            auVar71 = maxps(auVar272,auVar139);
            auVar88._0_8_ =
                 CONCAT44(fVar227 * fVar162 +
                          fVar208 * fStack_364 + fVar239 * fStack_2d4 + fVar244 * fStack_264,
                          fVar210 * fVar162 +
                          fVar261 * local_368 + fVar238 * local_2d8 + fVar243 * local_268) &
                 0x7fffffff7fffffff;
            auVar88._8_4_ =
                 ABS(fVar230 * fVar162 +
                     fVar209 * fStack_360 + fVar240 * fStack_2d0 + fVar248 * fStack_260);
            auVar88._12_4_ =
                 ABS(fVar235 * fVar162 +
                     fVar211 * fStack_35c + fVar242 * fStack_2cc + fVar250 * fStack_25c);
            auVar71 = maxps(auVar71,auVar88);
            uVar57 = -(uint)(local_358 <= auVar71._0_4_);
            uVar54 = -(uint)(fStack_354 <= auVar71._4_4_);
            uVar56 = -(uint)(fStack_350 <= auVar71._8_4_);
            uVar58 = -(uint)(fStack_34c <= auVar71._12_4_);
            fVar208 = (float)((uint)fVar165 & uVar57 | ~uVar57 & (uint)fVar266);
            fVar209 = (float)((uint)fVar166 & uVar54 | ~uVar54 & (uint)fVar267);
            fVar211 = (float)((uint)fVar212 & uVar56 | ~uVar56 & (uint)fVar268);
            fVar179 = (float)((uint)fVar229 & uVar58 | ~uVar58 & (uint)fVar179);
            fVar238 = (float)(~uVar57 & (uint)fVar253 | (uint)fVar232 & uVar57);
            fVar240 = (float)(~uVar54 & (uint)fVar259 | (uint)fVar234 & uVar54);
            fVar243 = (float)(~uVar56 & (uint)fVar260 | (uint)fVar245 & uVar56);
            fVar248 = (float)(~uVar58 & (uint)fVar262 | (uint)fVar249 & uVar58);
            fVar167 = auVar258._0_4_;
            fVar147 = auVar258._4_4_;
            fVar60 = auVar258._8_4_;
            fVar61 = auVar258._12_4_;
            auVar174._0_4_ = fVar279 * fVar279 + fVar167 * fVar167;
            auVar174._4_4_ = fVar281 * fVar281 + fVar147 * fVar147;
            auVar174._8_4_ = fVar101 * fVar101 + fVar60 * fVar60;
            auVar174._12_4_ = fVar130 * fVar130 + fVar61 * fVar61;
            auVar71 = rsqrtps(auVar195,auVar174);
            fVar129 = auVar71._0_4_;
            fVar131 = auVar71._4_4_;
            fVar134 = auVar71._8_4_;
            fVar145 = auVar71._12_4_;
            auVar196._0_4_ = fVar129 * fVar129 * auVar174._0_4_ * 0.5 * fVar129;
            auVar196._4_4_ = fVar131 * fVar131 * auVar174._4_4_ * 0.5 * fVar131;
            auVar196._8_4_ = fVar134 * fVar134 * auVar174._8_4_ * 0.5 * fVar134;
            auVar196._12_4_ = fVar145 * fVar145 * auVar174._12_4_ * 0.5 * fVar145;
            fVar197 = fVar129 * 1.5 - auVar196._0_4_;
            fVar164 = fVar131 * 1.5 - auVar196._4_4_;
            fVar205 = fVar134 * 1.5 - auVar196._8_4_;
            fVar207 = fVar145 * 1.5 - auVar196._12_4_;
            auVar175._0_4_ = fVar238 * fVar238 + fVar208 * fVar208;
            auVar175._4_4_ = fVar240 * fVar240 + fVar209 * fVar209;
            auVar175._8_4_ = fVar243 * fVar243 + fVar211 * fVar211;
            auVar175._12_4_ = fVar248 * fVar248 + fVar179 * fVar179;
            auVar71 = rsqrtps(auVar196,auVar175);
            fVar129 = auVar71._0_4_;
            fVar131 = auVar71._4_4_;
            fVar134 = auVar71._8_4_;
            fVar145 = auVar71._12_4_;
            fVar178 = fVar129 * 1.5 - fVar129 * fVar129 * auVar175._0_4_ * 0.5 * fVar129;
            fVar180 = fVar131 * 1.5 - fVar131 * fVar131 * auVar175._4_4_ * 0.5 * fVar131;
            fVar199 = fVar134 * 1.5 - fVar134 * fVar134 * auVar175._8_4_ * 0.5 * fVar134;
            fVar183 = fVar145 * 1.5 - fVar145 * fVar145 * auVar175._12_4_ * 0.5 * fVar145;
            fVar239 = fVar279 * fVar197 * auVar115._0_4_;
            fVar242 = fVar281 * fVar164 * auVar115._4_4_;
            fVar244 = fVar101 * fVar205 * auVar115._8_4_;
            fVar250 = fVar130 * fVar207 * auVar115._12_4_;
            fVar131 = -fVar167 * fVar197 * auVar115._0_4_;
            fVar134 = -fVar147 * fVar164 * auVar115._4_4_;
            fVar145 = -fVar60 * fVar205 * auVar115._8_4_;
            fVar167 = -fVar61 * fVar207 * auVar115._12_4_;
            fVar210 = fVar197 * 0.0 * auVar115._0_4_;
            fVar227 = fVar164 * 0.0 * auVar115._4_4_;
            fVar230 = fVar205 * 0.0 * auVar115._8_4_;
            fVar235 = fVar207 * 0.0 * auVar115._12_4_;
            local_2f8 = fVar132 + fVar210;
            fStack_2f4 = fVar133 + fVar227;
            fStack_2f0 = fVar135 + fVar230;
            fStack_2ec = fVar146 + fVar235;
            fVar253 = fVar238 * fVar178 * auVar274._0_4_;
            fVar259 = fVar240 * fVar180 * auVar274._4_4_;
            fVar260 = fVar243 * fVar199 * auVar274._8_4_;
            fVar261 = fVar248 * fVar183 * auVar274._12_4_;
            fVar262 = local_2e8 + fVar253;
            fVar266 = fStack_2e4 + fVar259;
            fVar267 = fStack_2e0 + fVar260;
            fVar268 = fStack_2dc + fVar261;
            fVar147 = -fVar208 * fVar178 * auVar274._0_4_;
            fVar60 = -fVar209 * fVar180 * auVar274._4_4_;
            fVar61 = -fVar211 * fVar199 * auVar274._8_4_;
            fVar129 = -fVar179 * fVar183 * auVar274._12_4_;
            fVar179 = fVar181 + fVar147;
            fVar208 = fVar182 + fVar60;
            fVar209 = fVar200 + fVar61;
            fVar211 = fVar206 + fVar129;
            fVar197 = fVar178 * 0.0 * auVar274._0_4_;
            fVar164 = fVar180 * 0.0 * auVar274._4_4_;
            fVar205 = fVar199 * 0.0 * auVar274._8_4_;
            fVar207 = fVar183 * 0.0 * auVar274._12_4_;
            fVar178 = (float)local_278._0_4_ - fVar239;
            fVar180 = (float)local_278._4_4_ - fVar242;
            fVar199 = fStack_270 - fVar244;
            fVar183 = fStack_26c - fVar250;
            fVar279 = fVar228 + fVar197;
            fVar281 = fVar231 + fVar164;
            fVar101 = fVar233 + fVar205;
            fVar130 = fVar277 + fVar207;
            fVar238 = local_248 - fVar131;
            fVar240 = fStack_244 - fVar134;
            fVar243 = fStack_240 - fVar145;
            fVar248 = fStack_23c - fVar167;
            fVar132 = fVar132 - fVar210;
            fVar133 = fVar133 - fVar227;
            fVar135 = fVar135 - fVar230;
            fVar146 = fVar146 - fVar235;
            uVar57 = -(uint)(0.0 < (fVar238 * (fVar279 - fVar132) - fVar132 * (fVar179 - fVar238)) *
                                   0.0 + (fVar132 * (fVar262 - fVar178) -
                                         (fVar279 - fVar132) * fVar178) * 0.0 +
                                         ((fVar179 - fVar238) * fVar178 -
                                         (fVar262 - fVar178) * fVar238));
            uVar54 = -(uint)(0.0 < (fVar240 * (fVar281 - fVar133) - fVar133 * (fVar208 - fVar240)) *
                                   0.0 + (fVar133 * (fVar266 - fVar180) -
                                         (fVar281 - fVar133) * fVar180) * 0.0 +
                                         ((fVar208 - fVar240) * fVar180 -
                                         (fVar266 - fVar180) * fVar240));
            uVar56 = -(uint)(0.0 < (fVar243 * (fVar101 - fVar135) - fVar135 * (fVar209 - fVar243)) *
                                   0.0 + (fVar135 * (fVar267 - fVar199) -
                                         (fVar101 - fVar135) * fVar199) * 0.0 +
                                         ((fVar209 - fVar243) * fVar199 -
                                         (fVar267 - fVar199) * fVar243));
            uVar58 = -(uint)(0.0 < (fVar248 * (fVar130 - fVar146) - fVar146 * (fVar211 - fVar248)) *
                                   0.0 + (fVar146 * (fVar268 - fVar183) -
                                         (fVar130 - fVar146) * fVar183) * 0.0 +
                                         ((fVar211 - fVar248) * fVar183 -
                                         (fVar268 - fVar183) * fVar248));
            fVar253 = (float)((uint)(local_2e8 - fVar253) & uVar57 |
                             ~uVar57 & (uint)((float)local_278._0_4_ + fVar239));
            fVar259 = (float)((uint)(fStack_2e4 - fVar259) & uVar54 |
                             ~uVar54 & (uint)((float)local_278._4_4_ + fVar242));
            fVar260 = (float)((uint)(fStack_2e0 - fVar260) & uVar56 |
                             ~uVar56 & (uint)(fStack_270 + fVar244));
            fVar261 = (float)((uint)(fStack_2dc - fVar261) & uVar58 |
                             ~uVar58 & (uint)(fStack_26c + fVar250));
            fVar148 = (float)((uint)(fVar181 - fVar147) & uVar57 |
                             ~uVar57 & (uint)(local_248 + fVar131));
            fVar149 = (float)((uint)(fVar182 - fVar60) & uVar54 |
                             ~uVar54 & (uint)(fStack_244 + fVar134));
            fVar151 = (float)((uint)(fVar200 - fVar61) & uVar56 |
                             ~uVar56 & (uint)(fStack_240 + fVar145));
            fVar163 = (float)((uint)(fVar206 - fVar129) & uVar58 |
                             ~uVar58 & (uint)(fStack_23c + fVar167));
            fVar131 = (float)((uint)(fVar228 - fVar197) & uVar57 | ~uVar57 & (uint)local_2f8);
            fVar134 = (float)((uint)(fVar231 - fVar164) & uVar54 | ~uVar54 & (uint)fStack_2f4);
            fVar145 = (float)((uint)(fVar233 - fVar205) & uVar56 | ~uVar56 & (uint)fStack_2f0);
            fVar167 = (float)((uint)(fVar277 - fVar207) & uVar58 | ~uVar58 & (uint)fStack_2ec);
            fVar210 = (float)((uint)fVar178 & uVar57 | ~uVar57 & (uint)fVar262);
            fVar227 = (float)((uint)fVar180 & uVar54 | ~uVar54 & (uint)fVar266);
            fVar230 = (float)((uint)fVar199 & uVar56 | ~uVar56 & (uint)fVar267);
            fVar235 = (float)((uint)fVar183 & uVar58 | ~uVar58 & (uint)fVar268);
            fVar239 = (float)((uint)fVar238 & uVar57 | ~uVar57 & (uint)fVar179);
            fVar242 = (float)((uint)fVar240 & uVar54 | ~uVar54 & (uint)fVar208);
            fVar244 = (float)((uint)fVar243 & uVar56 | ~uVar56 & (uint)fVar209);
            fVar250 = (float)((uint)fVar248 & uVar58 | ~uVar58 & (uint)fVar211);
            fVar197 = (float)((uint)fVar132 & uVar57 | ~uVar57 & (uint)fVar279);
            fVar164 = (float)((uint)fVar133 & uVar54 | ~uVar54 & (uint)fVar281);
            fVar205 = (float)((uint)fVar135 & uVar56 | ~uVar56 & (uint)fVar101);
            fVar207 = (float)((uint)fVar146 & uVar58 | ~uVar58 & (uint)fVar130);
            fVar262 = (float)((uint)fVar262 & uVar57 | ~uVar57 & (uint)fVar178) - fVar253;
            fVar266 = (float)((uint)fVar266 & uVar54 | ~uVar54 & (uint)fVar180) - fVar259;
            fVar267 = (float)((uint)fVar267 & uVar56 | ~uVar56 & (uint)fVar199) - fVar260;
            fVar268 = (float)((uint)fVar268 & uVar58 | ~uVar58 & (uint)fVar183) - fVar261;
            fVar238 = (float)((uint)fVar179 & uVar57 | ~uVar57 & (uint)fVar238) - fVar148;
            fVar240 = (float)((uint)fVar208 & uVar54 | ~uVar54 & (uint)fVar240) - fVar149;
            fVar243 = (float)((uint)fVar209 & uVar56 | ~uVar56 & (uint)fVar243) - fVar151;
            fVar248 = (float)((uint)fVar211 & uVar58 | ~uVar58 & (uint)fVar248) - fVar163;
            fVar179 = (float)((uint)fVar279 & uVar57 | ~uVar57 & (uint)fVar132) - fVar131;
            fVar181 = (float)((uint)fVar281 & uVar54 | ~uVar54 & (uint)fVar133) - fVar134;
            fVar182 = (float)((uint)fVar101 & uVar56 | ~uVar56 & (uint)fVar135) - fVar145;
            fVar200 = (float)((uint)fVar130 & uVar58 | ~uVar58 & (uint)fVar146) - fVar167;
            fVar228 = fVar253 - fVar210;
            fVar231 = fVar259 - fVar227;
            fVar233 = fVar260 - fVar230;
            fVar277 = fVar261 - fVar235;
            fVar147 = fVar148 - fVar239;
            fVar60 = fVar149 - fVar242;
            fVar61 = fVar151 - fVar244;
            fVar129 = fVar163 - fVar250;
            fVar178 = fVar131 - fVar197;
            fVar180 = fVar134 - fVar164;
            fVar199 = fVar145 - fVar205;
            fVar183 = fVar167 - fVar207;
            fVar206 = (fVar148 * fVar179 - fVar131 * fVar238) * 0.0 +
                      (fVar131 * fVar262 - fVar253 * fVar179) * 0.0 +
                      (fVar253 * fVar238 - fVar148 * fVar262);
            fVar208 = (fVar149 * fVar181 - fVar134 * fVar240) * 0.0 +
                      (fVar134 * fVar266 - fVar259 * fVar181) * 0.0 +
                      (fVar259 * fVar240 - fVar149 * fVar266);
            auVar157._4_4_ = fVar208;
            auVar157._0_4_ = fVar206;
            fVar209 = (fVar151 * fVar182 - fVar145 * fVar243) * 0.0 +
                      (fVar145 * fVar267 - fVar260 * fVar182) * 0.0 +
                      (fVar260 * fVar243 - fVar151 * fVar267);
            fVar211 = (fVar163 * fVar200 - fVar167 * fVar248) * 0.0 +
                      (fVar167 * fVar268 - fVar261 * fVar200) * 0.0 +
                      (fVar261 * fVar248 - fVar163 * fVar268);
            auVar275._0_4_ =
                 (fVar239 * fVar178 - fVar197 * fVar147) * 0.0 +
                 (fVar197 * fVar228 - fVar210 * fVar178) * 0.0 +
                 (fVar210 * fVar147 - fVar239 * fVar228);
            auVar275._4_4_ =
                 (fVar242 * fVar180 - fVar164 * fVar60) * 0.0 +
                 (fVar164 * fVar231 - fVar227 * fVar180) * 0.0 +
                 (fVar227 * fVar60 - fVar242 * fVar231);
            auVar275._8_4_ =
                 (fVar244 * fVar199 - fVar205 * fVar61) * 0.0 +
                 (fVar205 * fVar233 - fVar230 * fVar199) * 0.0 +
                 (fVar230 * fVar61 - fVar244 * fVar233);
            auVar275._12_4_ =
                 (fVar250 * fVar183 - fVar207 * fVar129) * 0.0 +
                 (fVar207 * fVar277 - fVar235 * fVar183) * 0.0 +
                 (fVar235 * fVar129 - fVar250 * fVar277);
            auVar157._8_4_ = fVar209;
            auVar157._12_4_ = fVar211;
            auVar71 = maxps(auVar157,auVar275);
            bVar31 = auVar71._0_4_ <= 0.0 && bVar31;
            auVar158._0_4_ = -(uint)bVar31;
            bVar32 = auVar71._4_4_ <= 0.0 && bVar32;
            auVar158._4_4_ = -(uint)bVar32;
            bVar33 = auVar71._8_4_ <= 0.0 && bVar33;
            auVar158._8_4_ = -(uint)bVar33;
            bVar34 = auVar71._12_4_ <= 0.0 && bVar34;
            auVar158._12_4_ = -(uint)bVar34;
            iVar37 = movmskps((int)(bezier_basis1 + lVar10),auVar158);
            if (iVar37 == 0) {
LAB_00a6aab7:
              iVar37 = 0;
              auVar141._8_8_ = uStack_3b0;
              auVar141._0_8_ = local_3b8;
            }
            else {
              fVar164 = fVar147 * fVar179 - fVar178 * fVar238;
              fVar205 = fVar60 * fVar181 - fVar180 * fVar240;
              fVar207 = fVar61 * fVar182 - fVar199 * fVar243;
              fVar210 = fVar129 * fVar200 - fVar183 * fVar248;
              fVar197 = fVar178 * fVar262 - fVar179 * fVar228;
              fVar180 = fVar180 * fVar266 - fVar181 * fVar231;
              fVar199 = fVar199 * fVar267 - fVar182 * fVar233;
              fVar183 = fVar183 * fVar268 - fVar200 * fVar277;
              fVar147 = fVar228 * fVar238 - fVar147 * fVar262;
              fVar227 = fVar231 * fVar240 - fVar60 * fVar266;
              fVar230 = fVar233 * fVar243 - fVar61 * fVar267;
              fVar235 = fVar277 * fVar248 - fVar129 * fVar268;
              auVar140._0_4_ = fVar197 * 0.0 + fVar147;
              auVar140._4_4_ = fVar180 * 0.0 + fVar227;
              auVar140._8_4_ = fVar199 * 0.0 + fVar230;
              auVar140._12_4_ = fVar183 * 0.0 + fVar235;
              auVar204._0_4_ = fVar164 * 0.0 + auVar140._0_4_;
              auVar204._4_4_ = fVar205 * 0.0 + auVar140._4_4_;
              auVar204._8_4_ = fVar207 * 0.0 + auVar140._8_4_;
              auVar204._12_4_ = fVar210 * 0.0 + auVar140._12_4_;
              auVar71 = rcpps(auVar140,auVar204);
              fVar60 = auVar71._0_4_;
              fVar61 = auVar71._4_4_;
              fVar129 = auVar71._8_4_;
              fVar178 = auVar71._12_4_;
              fVar60 = (1.0 - auVar204._0_4_ * fVar60) * fVar60 + fVar60;
              fVar61 = (1.0 - auVar204._4_4_ * fVar61) * fVar61 + fVar61;
              fVar129 = (1.0 - auVar204._8_4_ * fVar129) * fVar129 + fVar129;
              fVar178 = (1.0 - auVar204._12_4_ * fVar178) * fVar178 + fVar178;
              fVar131 = (fVar131 * fVar147 + fVar148 * fVar197 + fVar253 * fVar164) * fVar60;
              fVar134 = (fVar134 * fVar227 + fVar149 * fVar180 + fVar259 * fVar205) * fVar61;
              fVar145 = (fVar145 * fVar230 + fVar151 * fVar199 + fVar260 * fVar207) * fVar129;
              fVar167 = (fVar167 * fVar235 + fVar163 * fVar183 + fVar261 * fVar210) * fVar178;
              fVar147 = *(float *)(ray + k * 4 + 0x80);
              bVar31 = ((float)local_378._0_4_ <= fVar131 && fVar131 <= fVar147) && bVar31;
              auVar176._0_4_ = -(uint)bVar31;
              bVar32 = ((float)local_378._4_4_ <= fVar134 && fVar134 <= fVar147) && bVar32;
              auVar176._4_4_ = -(uint)bVar32;
              bVar33 = (fStack_370 <= fVar145 && fVar145 <= fVar147) && bVar33;
              auVar176._8_4_ = -(uint)bVar33;
              bVar34 = (fStack_36c <= fVar167 && fVar167 <= fVar147) && bVar34;
              auVar176._12_4_ = -(uint)bVar34;
              iVar37 = movmskps(iVar37,auVar176);
              if (iVar37 == 0) goto LAB_00a6aab7;
              auVar177._0_8_ =
                   CONCAT44(-(uint)(auVar204._4_4_ != 0.0 && bVar32),
                            -(uint)(auVar204._0_4_ != 0.0 && bVar31));
              auVar177._8_4_ = -(uint)(auVar204._8_4_ != 0.0 && bVar33);
              auVar177._12_4_ = -(uint)(auVar204._12_4_ != 0.0 && bVar34);
              iVar37 = movmskps(iVar37,auVar177);
              auVar141._8_8_ = uStack_3b0;
              auVar141._0_8_ = local_3b8;
              if (iVar37 != 0) {
                fVar206 = fVar206 * fVar60;
                fVar208 = fVar208 * fVar61;
                fVar209 = fVar209 * fVar129;
                fVar211 = fVar211 * fVar178;
                local_308 = (float)((uint)(1.0 - fVar206) & uVar57 | ~uVar57 & (uint)fVar206);
                fStack_304 = (float)((uint)(1.0 - fVar208) & uVar54 | ~uVar54 & (uint)fVar208);
                fStack_300 = (float)((uint)(1.0 - fVar209) & uVar56 | ~uVar56 & (uint)fVar209);
                fStack_2fc = (float)((uint)(1.0 - fVar211) & uVar58 | ~uVar58 & (uint)fVar211);
                local_3c8 = (float)(~uVar57 & (uint)(auVar275._0_4_ * fVar60) |
                                   (uint)(1.0 - auVar275._0_4_ * fVar60) & uVar57);
                fStack_3c4 = (float)(~uVar54 & (uint)(auVar275._4_4_ * fVar61) |
                                    (uint)(1.0 - auVar275._4_4_ * fVar61) & uVar54);
                fStack_3c0 = (float)(~uVar56 & (uint)(auVar275._8_4_ * fVar129) |
                                    (uint)(1.0 - auVar275._8_4_ * fVar129) & uVar56);
                fStack_3bc = (float)(~uVar58 & (uint)(auVar275._12_4_ * fVar178) |
                                    (uint)(1.0 - auVar275._12_4_ * fVar178) & uVar58);
                auVar141._8_4_ = auVar177._8_4_;
                auVar141._0_8_ = auVar177._0_8_;
                auVar141._12_4_ = auVar177._12_4_;
                local_318 = fVar131;
                fStack_314 = fVar134;
                fStack_310 = fVar145;
                fStack_30c = fVar167;
              }
            }
            iVar37 = movmskps(iVar37,auVar141);
            if (iVar37 != 0) {
              fVar60 = (auVar274._0_4_ - auVar115._0_4_) * local_308 + auVar115._0_4_;
              fVar61 = (auVar274._4_4_ - auVar115._4_4_) * fStack_304 + auVar115._4_4_;
              fVar129 = (auVar274._8_4_ - auVar115._8_4_) * fStack_300 + auVar115._8_4_;
              fVar131 = (auVar274._12_4_ - auVar115._12_4_) * fStack_2fc + auVar115._12_4_;
              fVar147 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              local_408._0_4_ = -(uint)(fVar147 * (fVar60 + fVar60) < local_318) & auVar141._0_4_;
              local_408._4_4_ = -(uint)(fVar147 * (fVar61 + fVar61) < fStack_314) & auVar141._4_4_;
              local_408._8_4_ = -(uint)(fVar147 * (fVar129 + fVar129) < fStack_310) & auVar141._8_4_
              ;
              local_408._12_4_ =
                   -(uint)(fVar147 * (fVar131 + fVar131) < fStack_30c) & auVar141._12_4_;
              iVar37 = movmskps(iVar37,local_408);
              if (iVar37 != 0) {
                local_3c8 = local_3c8 + local_3c8 + -1.0;
                fStack_3c4 = fStack_3c4 + fStack_3c4 + -1.0;
                fStack_3c0 = fStack_3c0 + fStack_3c0 + -1.0;
                fStack_3bc = fStack_3bc + fStack_3bc + -1.0;
                local_1f8 = local_318;
                fStack_1f4 = fStack_314;
                fStack_1f0 = fStack_310;
                fStack_1ec = fStack_30c;
                local_1c8 = CONCAT44(fStack_394,local_398);
                uStack_1c0 = CONCAT44(fStack_38c,fStack_390);
                local_1b8 = CONCAT44(fStack_3a4,local_3a8);
                uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
                local_1a8 = CONCAT44(fStack_384,local_388);
                uStack_1a0 = CONCAT44(fStack_37c,fStack_380);
                pGVar47 = (context->scene->geometries).items[(long)pRVar45].ptr;
                pRVar46 = pRVar45;
                if ((pGVar47->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar147 = (float)(int)local_1e8;
                  local_188[0] = (fVar147 + local_308 + 0.0) * local_98;
                  local_188[1] = (fVar147 + fStack_304 + 1.0) * fStack_94;
                  local_188[2] = (fVar147 + fStack_300 + 2.0) * fStack_90;
                  local_188[3] = (fVar147 + fStack_2fc + 3.0) * fStack_8c;
                  local_178 = CONCAT44(fStack_3c4,local_3c8);
                  uStack_170 = CONCAT44(fStack_3bc,fStack_3c0);
                  local_168[0] = local_318;
                  local_168[1] = fStack_314;
                  local_168[2] = fStack_310;
                  local_168[3] = fStack_30c;
                  auVar116._0_4_ = local_408._0_4_ & (uint)local_318;
                  auVar116._4_4_ = local_408._4_4_ & (uint)fStack_314;
                  auVar116._8_4_ = local_408._8_4_ & (uint)fStack_310;
                  auVar116._12_4_ = local_408._12_4_ & (uint)fStack_30c;
                  auVar142._0_8_ = CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
                  auVar142._8_4_ = ~local_408._8_4_ & 0x7f800000;
                  auVar142._12_4_ = ~local_408._12_4_ & 0x7f800000;
                  auVar142 = auVar142 | auVar116;
                  auVar159._4_4_ = auVar142._0_4_;
                  auVar159._0_4_ = auVar142._4_4_;
                  auVar159._8_4_ = auVar142._12_4_;
                  auVar159._12_4_ = auVar142._8_4_;
                  auVar71 = minps(auVar159,auVar142);
                  auVar117._0_8_ = auVar71._8_8_;
                  auVar117._8_4_ = auVar71._0_4_;
                  auVar117._12_4_ = auVar71._4_4_;
                  auVar71 = minps(auVar117,auVar71);
                  auVar118._0_8_ =
                       CONCAT44(-(uint)(auVar71._4_4_ == auVar142._4_4_) & local_408._4_4_,
                                -(uint)(auVar71._0_4_ == auVar142._0_4_) & local_408._0_4_);
                  auVar118._8_4_ = -(uint)(auVar71._8_4_ == auVar142._8_4_) & local_408._8_4_;
                  auVar118._12_4_ = -(uint)(auVar71._12_4_ == auVar142._12_4_) & local_408._12_4_;
                  iVar37 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar118);
                  auVar89 = local_408;
                  if (iVar37 != 0) {
                    auVar89._8_4_ = auVar118._8_4_;
                    auVar89._0_8_ = auVar118._0_8_;
                    auVar89._12_4_ = auVar118._12_4_;
                  }
                  uVar57 = movmskps(iVar37,auVar89);
                  lVar51 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar47->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar147 = local_188[lVar51];
                    uVar38 = *(undefined4 *)((long)&local_178 + lVar51 * 4);
                    fVar60 = 1.0 - fVar147;
                    fVar129 = fVar147 * fVar60 + fVar147 * fVar60;
                    fVar61 = fVar60 * fVar60 * -3.0;
                    fVar131 = (fVar60 * fVar60 - fVar129) * 3.0;
                    fVar60 = (fVar129 - fVar147 * fVar147) * 3.0;
                    fVar129 = fVar147 * fVar147 * 3.0;
                    *(float *)(ray + k * 4 + 0x80) = local_168[lVar51];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar61 * fVar96 +
                         fVar131 * local_398 + fVar60 * local_3a8 + fVar129 * local_388;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar61 * fVar97 +
                         fVar131 * fStack_394 + fVar60 * fStack_3a4 + fVar129 * fStack_384;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar61 * fVar98 +
                         fVar131 * fStack_390 + fVar60 * fStack_3a0 + fVar129 * fStack_380;
                    *(float *)(ray + k * 4 + 0xf0) = fVar147;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                    *(uint *)(ray + k * 4 + 0x110) = uVar55;
                    *(uint *)(ray + k * 4 + 0x120) = uVar53;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pLVar50 = local_3e0;
                    prim = local_3d0;
                    pre = local_3d8;
                  }
                  else {
                    auVar16 = *(undefined1 (*) [12])*local_2a8;
                    uStack_4fc = (undefined4)((ulong)*(undefined8 *)(*local_2a8 + 8) >> 0x20);
                    _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    fVar147 = local_318;
                    fVar60 = fStack_314;
                    fVar61 = fStack_310;
                    fVar129 = fStack_30c;
                    local_218 = local_308;
                    fStack_214 = fStack_304;
                    fStack_210 = fStack_300;
                    fStack_20c = fStack_2fc;
                    local_208 = local_3c8;
                    fStack_204 = fStack_3c4;
                    fStack_200 = fStack_3c0;
                    fStack_1fc = fStack_3bc;
                    local_1e4 = iVar8;
                    local_1d8 = uVar12;
                    uStack_1d0 = uVar35;
                    local_198 = local_408;
                    while( true ) {
                      local_f8 = local_188[lVar51];
                      local_e8 = *(undefined4 *)((long)&local_178 + lVar51 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_168[lVar51];
                      fVar131 = 1.0 - local_f8;
                      fVar145 = local_f8 * fVar131 + local_f8 * fVar131;
                      fVar167 = (fVar145 - local_f8 * local_f8) * 3.0;
                      fVar134 = local_f8 * local_f8 * 3.0;
                      fVar145 = (fVar131 * fVar131 - fVar145) * 3.0;
                      local_348.context = context->user;
                      fVar131 = fVar131 * fVar131 * -3.0;
                      local_128._0_4_ =
                           fVar131 * fVar96 +
                           fVar145 * local_398 + fVar167 * local_3a8 + fVar134 * local_388;
                      local_118 = fVar131 * fVar97 +
                                  fVar145 * fStack_394 + fVar167 * fStack_3a4 + fVar134 * fStack_384
                      ;
                      local_108 = fVar131 * fVar98 +
                                  fVar145 * fStack_390 + fVar167 * fStack_3a0 + fVar134 * fStack_380
                      ;
                      local_128._4_4_ = local_128._0_4_;
                      local_128._8_4_ = local_128._0_4_;
                      fStack_11c = (float)local_128._0_4_;
                      fStack_114 = local_118;
                      fStack_110 = local_118;
                      fStack_10c = local_118;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      uStack_e4 = local_e8;
                      uStack_e0 = local_e8;
                      uStack_dc = local_e8;
                      local_d8 = CONCAT44(uStack_84,local_88);
                      uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                      local_c8 = CONCAT44(uStack_74,local_78);
                      uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                      local_b8 = (local_348.context)->instID[0];
                      uStack_b4 = local_b8;
                      uStack_b0 = local_b8;
                      uStack_ac = local_b8;
                      local_a8 = (local_348.context)->instPrimID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_3f8._12_4_ = uStack_4fc;
                      local_3f8._0_12_ = auVar16;
                      local_348.valid = (int *)local_3f8;
                      pRVar46 = (RTCIntersectArguments *)pGVar47->userPtr;
                      local_348.hit = (RTCHitN *)local_128;
                      local_348.N = 4;
                      p_Var41 = pGVar47->intersectionFilterN;
                      local_348.geometryUserPtr = pRVar46;
                      local_348.ray = (RTCRayN *)ray;
                      if (p_Var41 != (RTCFilterFunctionN)0x0) {
                        p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&local_348);
                        fVar147 = local_318;
                        fVar60 = fStack_314;
                        fVar61 = fStack_310;
                        fVar129 = fStack_30c;
                      }
                      auVar119._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                      auVar119._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                      auVar119._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                      auVar119._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                      uVar57 = movmskps((int)p_Var41,auVar119);
                      pRVar42 = (RayHitK<4> *)(ulong)(uVar57 ^ 0xf);
                      if ((uVar57 ^ 0xf) == 0) {
                        auVar119 = auVar119 ^ _DAT_01f7ae20;
                      }
                      else {
                        pRVar46 = context->args;
                        p_Var41 = pRVar46->filter;
                        if ((p_Var41 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar46->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar47->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var41 = (RTCFilterFunctionN)(*p_Var41)(&local_348);
                          fVar147 = local_318;
                          fVar60 = fStack_314;
                          fVar61 = fStack_310;
                          fVar129 = fStack_30c;
                        }
                        auVar90._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                        auVar90._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                        auVar90._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                        auVar90._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                        auVar119 = auVar90 ^ _DAT_01f7ae20;
                        uVar57 = movmskps((int)p_Var41,auVar90);
                        pRVar42 = (RayHitK<4> *)(ulong)(uVar57 ^ 0xf);
                        if ((uVar57 ^ 0xf) != 0) {
                          RVar14 = *(RTCFeatureFlags *)((long)local_348.hit + 4);
                          uVar57 = *(uint *)((long)local_348.hit + 8);
                          uVar54 = *(uint *)((long)((long)local_348.hit + 8) + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0xc0) =
                               ~auVar90._0_4_ & *(RTCRayQueryFlags *)&(local_348.hit)->field_0x0 |
                               *(RTCRayQueryFlags *)(local_348.ray + 0xc0) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xc4) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xc4) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 200) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 200) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0xcc) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0xcc) & auVar90._12_4_;
                          RVar14 = *(RTCFeatureFlags *)((long)((long)local_348.hit + 0x10) + 4);
                          uVar57 = *(uint *)((long)local_348.hit + 0x18);
                          uVar54 = *(uint *)((long)((long)local_348.hit + 0x18) + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0xd0) =
                               ~auVar90._0_4_ & *(RTCRayQueryFlags *)((long)local_348.hit + 0x10) |
                               *(RTCRayQueryFlags *)(local_348.ray + 0xd0) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xd4) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xd4) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 0xd8) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 0xd8) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0xdc) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0xdc) & auVar90._12_4_;
                          RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->
                                   feature_mask;
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                             ->context;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0xe0) =
                               ~auVar90._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x20))->flags |
                               *(RTCRayQueryFlags *)(local_348.ray + 0xe0) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xe4) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xe4) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 0xe8) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 0xe8) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0xec) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0xec) & auVar90._12_4_;
                          RVar14 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                            ->filter + 4);
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x20))
                                             ->intersect;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x20))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0xf0) =
                               ~auVar90._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_348.hit + 0x20))->filter |
                               *(RTCRayQueryFlags *)(local_348.ray + 0xf0) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0xf4) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0xf4) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 0xf8) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 0xf8) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0xfc) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0xfc) & auVar90._12_4_;
                          RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->
                                   feature_mask;
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                             ->context;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x100) =
                               ~auVar90._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x40))->flags |
                               *(RTCRayQueryFlags *)(local_348.ray + 0x100) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0x104) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0x104) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 0x108) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 0x108) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0x10c) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0x10c) & auVar90._12_4_;
                          RVar14 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                            ->filter + 4);
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x40))
                                             ->intersect;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x40))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x110) =
                               *(RTCRayQueryFlags *)(local_348.ray + 0x110) & auVar90._0_4_ |
                               ~auVar90._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_348.hit + 0x40))->filter;
                          *(RTCFeatureFlags *)(local_348.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_348.ray + 0x114) & auVar90._4_4_ |
                               ~auVar90._4_4_ & RVar14;
                          *(uint *)(local_348.ray + 0x118) =
                               *(uint *)(local_348.ray + 0x118) & auVar90._8_4_ |
                               ~auVar90._8_4_ & uVar57;
                          *(uint *)(local_348.ray + 0x11c) =
                               *(uint *)(local_348.ray + 0x11c) & auVar90._12_4_ |
                               ~auVar90._12_4_ & uVar54;
                          RVar14 = ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->
                                   feature_mask;
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                             ->context;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x120) =
                               *(RTCRayQueryFlags *)(local_348.ray + 0x120) & auVar90._0_4_ |
                               ~auVar90._0_4_ &
                               ((RTCIntersectArguments *)((long)local_348.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_348.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_348.ray + 0x124) & auVar90._4_4_ |
                               ~auVar90._4_4_ & RVar14;
                          *(uint *)(local_348.ray + 0x128) =
                               *(uint *)(local_348.ray + 0x128) & auVar90._8_4_ |
                               ~auVar90._8_4_ & uVar57;
                          *(uint *)(local_348.ray + 300) =
                               *(uint *)(local_348.ray + 300) & auVar90._12_4_ |
                               ~auVar90._12_4_ & uVar54;
                          RVar14 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                            ->filter + 4);
                          uVar57 = *(uint *)&((RTCIntersectArguments *)((long)local_348.hit + 0x60))
                                             ->intersect;
                          uVar54 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_348.hit + 0x60))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_348.ray + 0x130) =
                               ~auVar90._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_348.hit + 0x60))->filter |
                               *(RTCRayQueryFlags *)(local_348.ray + 0x130) & auVar90._0_4_;
                          *(RTCFeatureFlags *)(local_348.ray + 0x134) =
                               ~auVar90._4_4_ & RVar14 |
                               *(RTCFeatureFlags *)(local_348.ray + 0x134) & auVar90._4_4_;
                          *(uint *)(local_348.ray + 0x138) =
                               ~auVar90._8_4_ & uVar57 |
                               *(uint *)(local_348.ray + 0x138) & auVar90._8_4_;
                          *(uint *)(local_348.ray + 0x13c) =
                               ~auVar90._12_4_ & uVar54 |
                               *(uint *)(local_348.ray + 0x13c) & auVar90._12_4_;
                          auVar5._0_4_ = *(undefined4 *)(local_348.hit + 0x80);
                          auVar5._4_4_ = *(undefined4 *)(local_348.hit + 0x84);
                          auVar5._8_8_ = *(undefined8 *)(local_348.hit + 0x88);
                          *(undefined1 (*) [16])(local_348.ray + 0x140) =
                               ~auVar90 & auVar5 |
                               *(undefined1 (*) [16])(local_348.ray + 0x140) & auVar90;
                          pRVar42 = (RayHitK<4> *)local_348.ray;
                          pRVar46 = (RTCIntersectArguments *)local_348.hit;
                        }
                      }
                      auVar120._0_4_ = auVar119._0_4_ << 0x1f;
                      auVar120._4_4_ = auVar119._4_4_ << 0x1f;
                      auVar120._8_4_ = auVar119._8_4_ << 0x1f;
                      auVar120._12_4_ = auVar119._12_4_ << 0x1f;
                      iVar37 = movmskps((int)pRVar42,auVar120);
                      if (iVar37 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                      }
                      else {
                        local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_518._4_4_ = 0;
                        fStack_510 = 0.0;
                        uStack_50c = 0;
                      }
                      *(undefined4 *)(local_408 + lVar51 * 4) = 0;
                      local_408._0_4_ = -(uint)(fVar147 <= (float)local_518._0_4_) & local_408._0_4_
                      ;
                      local_408._4_4_ = -(uint)(fVar60 <= (float)local_518._0_4_) & local_408._4_4_;
                      local_408._8_4_ = -(uint)(fVar61 <= (float)local_518._0_4_) & local_408._8_4_;
                      local_408._12_4_ =
                           -(uint)(fVar129 <= (float)local_518._0_4_) & local_408._12_4_;
                      iVar37 = movmskps(iVar37,local_408);
                      pLVar50 = local_3e0;
                      prim = local_3d0;
                      pre = local_3d8;
                      if (iVar37 == 0) break;
                      auVar121._0_4_ = local_408._0_4_ & (uint)fVar147;
                      auVar121._4_4_ = local_408._4_4_ & (uint)fVar60;
                      auVar121._8_4_ = local_408._8_4_ & (uint)fVar61;
                      auVar121._12_4_ = local_408._12_4_ & (uint)fVar129;
                      auVar143._0_8_ =
                           CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
                      auVar143._8_4_ = ~local_408._8_4_ & 0x7f800000;
                      auVar143._12_4_ = ~local_408._12_4_ & 0x7f800000;
                      auVar143 = auVar143 | auVar121;
                      auVar160._4_4_ = auVar143._0_4_;
                      auVar160._0_4_ = auVar143._4_4_;
                      auVar160._8_4_ = auVar143._12_4_;
                      auVar160._12_4_ = auVar143._8_4_;
                      auVar71 = minps(auVar160,auVar143);
                      auVar122._0_8_ = auVar71._8_8_;
                      auVar122._8_4_ = auVar71._0_4_;
                      auVar122._12_4_ = auVar71._4_4_;
                      auVar71 = minps(auVar122,auVar71);
                      auVar123._0_8_ =
                           CONCAT44(-(uint)(auVar71._4_4_ == auVar143._4_4_) & local_408._4_4_,
                                    -(uint)(auVar71._0_4_ == auVar143._0_4_) & local_408._0_4_);
                      auVar123._8_4_ = -(uint)(auVar71._8_4_ == auVar143._8_4_) & local_408._8_4_;
                      auVar123._12_4_ =
                           -(uint)(auVar71._12_4_ == auVar143._12_4_) & local_408._12_4_;
                      iVar37 = movmskps(iVar37,auVar123);
                      auVar91 = local_408;
                      if (iVar37 != 0) {
                        auVar91._8_4_ = auVar123._8_4_;
                        auVar91._0_8_ = auVar123._0_8_;
                        auVar91._12_4_ = auVar123._12_4_;
                      }
                      uVar38 = movmskps(iVar37,auVar91);
                      uVar40 = CONCAT44((int)((ulong)pRVar42 >> 0x20),uVar38);
                      lVar51 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar43 = (int)pRVar46;
          lVar48 = lVar48 + 4;
        } while ((int)lVar48 < iVar8);
      }
      fVar147 = *(float *)(ray + k * 4 + 0x80);
      auVar114._4_4_ = -(uint)(fStack_44 <= fVar147);
      auVar114._0_4_ = -(uint)(local_48 <= fVar147);
      auVar114._8_4_ = -(uint)(fStack_40 <= fVar147);
      auVar114._12_4_ = -(uint)(fStack_3c <= fVar147);
      uVar53 = movmskps(iVar43,auVar114);
      uVar52 = uVar52 & uVar52 + 0xf & uVar53;
    } while (uVar52 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }